

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

void ImGui::ShowDemoWindow(bool *p_open)

{
  char cVar1;
  ushort uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  ImU32 IVar7;
  ImU32 IVar8;
  uint uVar9;
  ImGuiMouseCursor IVar10;
  ImGuiContext *pIVar11;
  MyDocument *pMVar12;
  MyDocument **ppMVar13;
  char *pcVar14;
  char *pcVar15;
  ImGuiIO *pIVar16;
  ImDrawList *pIVar17;
  ImGuiStyle *pIVar18;
  ImVec2 *pIVar19;
  unsigned_short *puVar20;
  int doc_n;
  int iVar21;
  bool *pbVar22;
  int doc_n_3;
  int i;
  ImGuiWindowFlags flags;
  int open_count;
  int iVar23;
  undefined8 *puVar24;
  int i_5;
  long lVar25;
  int i_3;
  undefined **ppuVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  double dVar30;
  undefined4 extraout_XMM0_Db;
  ImVec2 IVar31;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  ulong uVar32;
  float local_158;
  float fStack_154;
  undefined4 uStack_14c;
  ImVec2 canvas_sz;
  ImVec2 local_140;
  ImVec2 local_138 [2];
  undefined1 local_128 [8];
  undefined8 uStack_120;
  ImVec2 gradient_size;
  float local_108;
  float fStack_104;
  ImVec2 local_f0;
  ImVec2 local_e8;
  int local_dc;
  MyDocument *doc;
  ImVec2 IStack_d0;
  ImVec2 local_c8;
  ImVec2 IStack_c0;
  char *local_b8;
  char *pcStack_b0;
  char *local_a8;
  ImVec2 local_58;
  bool *local_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  pIVar11 = GetCurrentContext();
  if (pIVar11 == (ImGuiContext *)0x0) {
    __assert_fail("ImGui::GetCurrentContext() != __null && \"Missing dear imgui context. Refer to examples app!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O2/_deps/imgui-src/imgui_demo.cpp"
                  ,0xf9,"void ImGui::ShowDemoWindow(bool *)");
  }
  if ((ShowDemoWindow::show_app_main_menu_bar == true) && (bVar3 = BeginMainMenuBar(), bVar3)) {
    bVar3 = BeginMenu("File",true);
    if (bVar3) {
      ShowExampleMenuFile();
      EndMenu();
    }
    bVar3 = BeginMenu("Edit",true);
    if (bVar3) {
      MenuItem("Undo","CTRL+Z",false,true);
      MenuItem("Redo","CTRL+Y",false,false);
      Separator();
      MenuItem("Cut","CTRL+X",false,true);
      MenuItem("Copy","CTRL+C",false,true);
      MenuItem("Paste","CTRL+V",false,true);
      EndMenu();
    }
    EndMainMenuBar();
  }
  if (ShowDemoWindow::show_app_documents == true) {
    if ((ShowExampleAppDocuments(bool*)::app == '\0') &&
       (iVar21 = __cxa_guard_acquire(&ShowExampleAppDocuments(bool*)::app), iVar21 != 0)) {
      ExampleAppDocuments::ExampleAppDocuments
                ((ExampleAppDocuments *)&ShowExampleAppDocuments(bool*)::app);
      __cxa_atexit(ExampleAppDocuments::~ExampleAppDocuments,&ShowExampleAppDocuments(bool*)::app,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppDocuments(bool*)::app);
    }
    bVar3 = Begin("Example: Documents",&ShowDemoWindow::show_app_documents,0x400);
    if (bVar3) {
      bVar3 = BeginMenuBar();
      if (bVar3) {
        bVar3 = BeginMenu("File",true);
        if (bVar3) {
          iVar23 = 0;
          for (iVar21 = 0; iVar21 < ShowExampleAppDocuments(bool*)::app; iVar21 = iVar21 + 1) {
            pMVar12 = ImVector<MyDocument>::operator[]
                                ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,iVar21
                                );
            iVar23 = iVar23 + (uint)pMVar12->Open;
          }
          bVar3 = BeginMenu("Open",iVar23 < ShowExampleAppDocuments(bool*)::app);
          if (bVar3) {
            for (iVar21 = 0; iVar21 < ShowExampleAppDocuments(bool*)::app; iVar21 = iVar21 + 1) {
              pMVar12 = ImVector<MyDocument>::operator[]
                                  ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,
                                   iVar21);
              if ((pMVar12->Open == false) &&
                 (bVar3 = MenuItem(pMVar12->Name,(char *)0x0,false,true), bVar3)) {
                pMVar12->Open = true;
              }
            }
            EndMenu();
          }
          iVar21 = 0;
          bVar3 = MenuItem("Close All Documents",(char *)0x0,false,iVar23 != 0);
          if (bVar3) {
            for (; iVar21 < ShowExampleAppDocuments(bool*)::app; iVar21 = iVar21 + 1) {
              pMVar12 = ImVector<MyDocument>::operator[]
                                  ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,
                                   iVar21);
              pMVar12->WantClose = true;
            }
          }
          MenuItem("Exit","Alt+F4",false,true);
          EndMenu();
        }
        EndMenuBar();
      }
      for (iVar21 = 0; iVar21 < ShowExampleAppDocuments(bool*)::app; iVar21 = iVar21 + 1) {
        pMVar12 = ImVector<MyDocument>::operator[]
                            ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,iVar21);
        if (iVar21 != 0) {
          SameLine(0.0,-1.0);
        }
        PushID(pMVar12);
        bVar3 = Checkbox(pMVar12->Name,&pMVar12->Open);
        if ((bVar3) && (pMVar12->Open == false)) {
          pMVar12->Open = false;
          pMVar12->Dirty = false;
        }
        PopID();
      }
      Separator();
      bVar3 = BeginTabBar("##tabs",0x41);
      if (bVar3) {
        for (iVar21 = 0; iVar21 < ShowExampleAppDocuments(bool*)::app; iVar21 = iVar21 + 1) {
          pMVar12 = ImVector<MyDocument>::operator[]
                              ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,iVar21);
          bVar3 = pMVar12->Open;
          if ((bVar3 == false) && (pMVar12->OpenPrev == true)) {
            SetTabItemClosed(pMVar12->Name);
            bVar3 = pMVar12->Open;
          }
          pMVar12->OpenPrev = bVar3;
        }
        for (iVar21 = 0; iVar21 < ShowExampleAppDocuments(bool*)::app; iVar21 = iVar21 + 1) {
          pMVar12 = ImVector<MyDocument>::operator[]
                              ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,iVar21);
          if (pMVar12->Open == true) {
            bVar3 = BeginTabItem(pMVar12->Name,&pMVar12->Open,(uint)pMVar12->Dirty);
            if ((pMVar12->Open == false) && (pMVar12->Dirty == true)) {
              pMVar12->Open = true;
              pMVar12->WantClose = true;
            }
            MyDocument::DisplayContextMenu(pMVar12);
            if (bVar3) {
              MyDocument::DisplayContents(pMVar12);
              EndTabItem();
            }
          }
        }
        EndTabBar();
      }
      if ((ShowExampleAppDocuments(bool*)::close_queue == '\0') &&
         (iVar21 = __cxa_guard_acquire(&ShowExampleAppDocuments(bool*)::close_queue), iVar21 != 0))
      {
        _close_queue = (undefined1  [16])0x0;
        __cxa_atexit(ImVector<MyDocument_*>::~ImVector,&ShowExampleAppDocuments(bool*)::close_queue,
                     &__dso_handle);
        __cxa_guard_release(&ShowExampleAppDocuments(bool*)::close_queue);
      }
      if (ShowExampleAppDocuments(bool*)::close_queue == 0) {
        for (iVar21 = 0; iVar21 < ShowExampleAppDocuments(bool*)::app; iVar21 = iVar21 + 1) {
          doc = ImVector<MyDocument>::operator[]
                          ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,iVar21);
          if (doc->WantClose == true) {
            doc->WantClose = false;
            ImVector<MyDocument_*>::push_back
                      ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue,&doc);
          }
        }
        if (ShowExampleAppDocuments(bool*)::close_queue == 0) goto LAB_0012c73b;
      }
      iVar23 = 0;
      iVar21 = ShowExampleAppDocuments(bool*)::close_queue;
      for (i = 0; i < iVar21; i = i + 1) {
        ppMVar13 = ImVector<MyDocument_*>::operator[]
                             ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue
                              ,i);
        iVar23 = iVar23 + (uint)(*ppMVar13)->Dirty;
        iVar21 = ShowExampleAppDocuments(bool*)::close_queue;
      }
      if (iVar23 == 0) {
        for (iVar23 = 0; iVar23 < iVar21; iVar23 = iVar23 + 1) {
          ppMVar13 = ImVector<MyDocument_*>::operator[]
                               ((ImVector<MyDocument_*> *)
                                &ShowExampleAppDocuments(bool*)::close_queue,iVar23);
          pMVar12 = *ppMVar13;
          pMVar12->Open = false;
          pMVar12->Dirty = false;
          iVar21 = ShowExampleAppDocuments(bool*)::close_queue;
        }
        ImVector<MyDocument_*>::clear
                  ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue);
      }
      else {
        bVar3 = IsPopupOpen("Save?",0);
        if (!bVar3) {
          OpenPopup("Save?",0);
        }
        bVar3 = BeginPopupModal("Save?",(bool *)0x0,0);
        if (bVar3) {
          Text("Save change to the following items?");
          SetNextItemWidth(-1.0);
          bVar3 = ListBoxHeader("##",iVar23,6);
          if (bVar3) {
            for (iVar21 = 0; iVar21 < ShowExampleAppDocuments(bool*)::close_queue;
                iVar21 = iVar21 + 1) {
              ppMVar13 = ImVector<MyDocument_*>::operator[]
                                   ((ImVector<MyDocument_*> *)
                                    &ShowExampleAppDocuments(bool*)::close_queue,iVar21);
              if ((*ppMVar13)->Dirty == true) {
                ppMVar13 = ImVector<MyDocument_*>::operator[]
                                     ((ImVector<MyDocument_*> *)
                                      &ShowExampleAppDocuments(bool*)::close_queue,iVar21);
                Text("%s",(*ppMVar13)->Name);
              }
            }
            ListBoxFooter();
          }
          doc = (MyDocument *)0x42a00000;
          bVar3 = Button("Yes",(ImVec2 *)&doc);
          if (bVar3) {
            for (iVar21 = 0; iVar21 < ShowExampleAppDocuments(bool*)::close_queue;
                iVar21 = iVar21 + 1) {
              ppMVar13 = ImVector<MyDocument_*>::operator[]
                                   ((ImVector<MyDocument_*> *)
                                    &ShowExampleAppDocuments(bool*)::close_queue,iVar21);
              if ((*ppMVar13)->Dirty == true) {
                ppMVar13 = ImVector<MyDocument_*>::operator[]
                                     ((ImVector<MyDocument_*> *)
                                      &ShowExampleAppDocuments(bool*)::close_queue,iVar21);
                (*ppMVar13)->Dirty = false;
              }
              ppMVar13 = ImVector<MyDocument_*>::operator[]
                                   ((ImVector<MyDocument_*> *)
                                    &ShowExampleAppDocuments(bool*)::close_queue,iVar21);
              pMVar12 = *ppMVar13;
              pMVar12->Open = false;
              pMVar12->Dirty = false;
            }
            ImVector<MyDocument_*>::clear
                      ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue);
            CloseCurrentPopup();
          }
          SameLine(0.0,-1.0);
          doc = (MyDocument *)0x42a00000;
          bVar3 = Button("No",(ImVec2 *)&doc);
          if (bVar3) {
            for (iVar21 = 0; iVar21 < ShowExampleAppDocuments(bool*)::close_queue;
                iVar21 = iVar21 + 1) {
              ppMVar13 = ImVector<MyDocument_*>::operator[]
                                   ((ImVector<MyDocument_*> *)
                                    &ShowExampleAppDocuments(bool*)::close_queue,iVar21);
              pMVar12 = *ppMVar13;
              pMVar12->Open = false;
              pMVar12->Dirty = false;
            }
            ImVector<MyDocument_*>::clear
                      ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue);
            CloseCurrentPopup();
          }
          SameLine(0.0,-1.0);
          doc = SUB168(ZEXT416(0x42a00000),0);
          bVar3 = Button("Cancel",(ImVec2 *)&doc);
          if (bVar3) {
            ImVector<MyDocument_*>::clear
                      ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue);
            CloseCurrentPopup();
          }
          EndPopup();
        }
      }
    }
LAB_0012c73b:
    End();
  }
  if (ShowDemoWindow::show_app_console == true) {
    if ((ShowExampleAppConsole(bool*)::console == '\0') &&
       (iVar21 = __cxa_guard_acquire(&ShowExampleAppConsole(bool*)::console), iVar21 != 0)) {
      ExampleAppConsole::ExampleAppConsole
                ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console);
      __cxa_atexit(ExampleAppConsole::~ExampleAppConsole,ShowExampleAppConsole(bool*)::console,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppConsole(bool*)::console);
    }
    ExampleAppConsole::Draw
              ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console,"Example: Console",
               &ShowDemoWindow::show_app_console);
  }
  if (ShowDemoWindow::show_app_log == true) {
    local_50 = p_open;
    if ((ShowExampleAppLog(bool*)::log == '\0') &&
       (iVar21 = __cxa_guard_acquire(&ShowExampleAppLog(bool*)::log), iVar21 != 0)) {
      ExampleAppLog::ExampleAppLog((ExampleAppLog *)ShowExampleAppLog(bool*)::log);
      __cxa_atexit(ExampleAppLog::~ExampleAppLog,ShowExampleAppLog(bool*)::log,&__dso_handle);
      __cxa_guard_release(&ShowExampleAppLog(bool*)::log);
    }
    doc = (MyDocument *)0x43c8000043fa0000;
    SetNextWindowSize((ImVec2 *)&doc,4);
    Begin("Example: Log",&ShowDemoWindow::show_app_log,0);
    bVar3 = SmallButton("[Debug] Add 5 entries");
    if (bVar3) {
      iVar21 = 5;
      while (bVar3 = iVar21 != 0, iVar21 = iVar21 + -1, bVar3) {
        uVar6 = GetFrameCount();
        GetTime();
        ExampleAppLog::AddLog
                  ((ExampleAppLog *)ShowExampleAppLog(bool*)::log,
                   "[%05d] [%s] Hello, current time is %.1f, here\'s a word: \'%s\'\n",(ulong)uVar6)
        ;
        ShowExampleAppLog(bool*)::counter = ShowExampleAppLog(bool*)::counter + 1;
      }
    }
    End();
    ExampleAppLog::Draw((ExampleAppLog *)ShowExampleAppLog(bool*)::log,"Example: Log",
                        &ShowDemoWindow::show_app_log);
    p_open = local_50;
  }
  if (ShowDemoWindow::show_app_layout == true) {
    doc = (MyDocument *)0x43dc000043fa0000;
    SetNextWindowSize((ImVec2 *)&doc,4);
    bVar3 = Begin("Example: Simple layout",&ShowDemoWindow::show_app_layout,0x400);
    if (bVar3) {
      bVar3 = BeginMenuBar();
      if (bVar3) {
        bVar3 = BeginMenu("File",true);
        if (bVar3) {
          bVar3 = MenuItem("Close",(char *)0x0,false,true);
          if (bVar3) {
            ShowDemoWindow::show_app_layout = false;
          }
          EndMenu();
        }
        EndMenuBar();
      }
      doc = SUB168(ZEXT416(0x43160000),0);
      BeginChild("left pane",(ImVec2 *)&doc,true,0);
      uVar32 = 0;
      while (iVar21 = (int)uVar32, iVar21 != 100) {
        sprintf((char *)&doc,"MyObject %d",uVar32);
        canvas_sz.x = 0.0;
        canvas_sz.y = 0.0;
        bVar3 = Selectable((char *)&doc,iVar21 == ShowExampleAppLayout(bool*)::selected,0,&canvas_sz
                          );
        if (bVar3) {
          ShowExampleAppLayout(bool*)::selected = iVar21;
        }
        uVar32 = (ulong)(iVar21 + 1);
      }
      EndChild();
      SameLine(0.0,-1.0);
      BeginGroup();
      fVar27 = GetFrameHeightWithSpacing();
      doc = (MyDocument *)((ulong)((uint)fVar27 ^ (uint)DAT_001b0130) << 0x20);
      BeginChild("item view",(ImVec2 *)&doc,false,0);
      Text("MyObject: %d");
      Separator();
      bVar3 = BeginTabBar("##Tabs",0);
      if (bVar3) {
        bVar3 = BeginTabItem("Description",(bool *)0x0,0);
        if (bVar3) {
          TextWrapped(
                     "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. "
                     );
          EndTabItem();
        }
        bVar3 = BeginTabItem("Details",(bool *)0x0,0);
        if (bVar3) {
          Text("ID: 0123456789");
          EndTabItem();
        }
        EndTabBar();
      }
      EndChild();
      doc = (MyDocument *)0x0;
      Button("Revert",(ImVec2 *)&doc);
      SameLine(0.0,-1.0);
      doc = (MyDocument *)0x0;
      Button("Save",(ImVec2 *)&doc);
      EndGroup();
    }
    End();
  }
  if (ShowDemoWindow::show_app_property_editor == true) {
    doc = (MyDocument *)0x43e1000043d70000;
    SetNextWindowSize((ImVec2 *)&doc,4);
    bVar3 = Begin("Example: Property editor",&ShowDemoWindow::show_app_property_editor,0);
    if (bVar3) {
      HelpMarker(
                "This example shows how you may implement a property editor using two columns.\nAll objects/fields data are dummies here.\nRemember that in many simple cases, you can use ImGui::SameLine(xxx) to position\nyour cursor horizontally instead of using the Columns() API."
                );
      doc = (MyDocument *)0x4000000040000000;
      PushStyleVar(10,(ImVec2 *)&doc);
      doc = (MyDocument *)0x0;
      bVar3 = BeginTable("split",2,0x501,(ImVec2 *)&doc,0.0);
      if (bVar3) {
        for (iVar21 = 0; iVar21 != 4; iVar21 = iVar21 + 1) {
          ShowPlaceholderObject("Object",iVar21);
        }
        EndTable();
      }
      PopStyleVar(1);
    }
    End();
  }
  if (ShowDemoWindow::show_app_long_text == true) {
    doc = (MyDocument *)0x4416000044020000;
    SetNextWindowSize((ImVec2 *)&doc,4);
    bVar3 = Begin("Example: Long text display",&ShowDemoWindow::show_app_long_text,0);
    if (bVar3) {
      if ((ShowExampleAppLongText(bool*)::log == '\0') &&
         (iVar21 = __cxa_guard_acquire(&ShowExampleAppLongText(bool*)::log), iVar21 != 0)) {
        _log = (undefined1  [16])0x0;
        __cxa_atexit(ImGuiTextBuffer::~ImGuiTextBuffer,&ShowExampleAppLongText(bool*)::log,
                     &__dso_handle);
        __cxa_guard_release(&ShowExampleAppLongText(bool*)::log);
      }
      Text("Printing unusually long amount of text.");
      Combo("Test type",&ShowExampleAppLongText(bool*)::test_type,"Single call to TextUnformatted()"
            ,-1);
      uVar32 = (ulong)(ShowExampleAppLongText(bool*)::log - 1);
      if (ShowExampleAppLongText(bool*)::log == 0) {
        uVar32 = 0;
      }
      Text("Buffer contents: %d lines, %d bytes",(ulong)ShowExampleAppLongText(bool*)::lines,uVar32)
      ;
      doc = (MyDocument *)0x0;
      bVar3 = Button("Clear",(ImVec2 *)&doc);
      if (bVar3) {
        ImVector<char>::clear((ImVector<char> *)&ShowExampleAppLongText(bool*)::log);
        ShowExampleAppLongText(bool*)::lines = 0;
      }
      SameLine(0.0,-1.0);
      doc = (MyDocument *)0x0;
      bVar3 = Button("Add 1000 lines",(ImVec2 *)&doc);
      if (bVar3) {
        for (iVar21 = 0; iVar21 != 1000; iVar21 = iVar21 + 1) {
          ImGuiTextBuffer::appendf
                    ((ImGuiTextBuffer *)&ShowExampleAppLongText(bool*)::log,
                     "%i The quick brown fox jumps over the lazy dog\n",
                     (ulong)(ShowExampleAppLongText(bool*)::lines + iVar21));
        }
        ShowExampleAppLongText(bool*)::lines = ShowExampleAppLongText(bool*)::lines + 1000;
      }
      doc = (MyDocument *)0x0;
      BeginChild("Log",(ImVec2 *)&doc,false,0);
      if (ShowExampleAppLongText(bool*)::test_type == 2) {
        doc = (MyDocument *)0x0;
        PushStyleVar(0xd,(ImVec2 *)&doc);
        for (uVar32 = 0; (int)uVar32 < (int)ShowExampleAppLongText(bool*)::lines;
            uVar32 = (ulong)((int)uVar32 + 1)) {
          Text("%i The quick brown fox jumps over the lazy dog",uVar32);
        }
        PopStyleVar(1);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 1) {
        doc = (MyDocument *)0x0;
        PushStyleVar(0xd,(ImVec2 *)&doc);
        ImGuiListClipper::ImGuiListClipper((ImGuiListClipper *)&doc);
        ImGuiListClipper::Begin((ImGuiListClipper *)&doc,ShowExampleAppLongText(bool*)::lines,-1.0);
        while (bVar3 = ImGuiListClipper::Step((ImGuiListClipper *)&doc), bVar3) {
          uVar6 = (uint)doc._0_4_;
          while( true ) {
            if ((int)doc._4_4_ <= (int)uVar6) break;
            Text("%i The quick brown fox jumps over the lazy dog",(ulong)uVar6);
            uVar6 = uVar6 + 1;
          }
        }
        PopStyleVar(1);
        ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)&doc);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 0) {
        pcVar14 = ImGuiTextBuffer::begin((ImGuiTextBuffer *)&ShowExampleAppLongText(bool*)::log);
        pcVar15 = ImGuiTextBuffer::end((ImGuiTextBuffer *)&ShowExampleAppLongText(bool*)::log);
        TextUnformatted(pcVar14,pcVar15);
      }
      EndChild();
    }
    End();
  }
  if (ShowDemoWindow::show_app_auto_resize == true) {
    bVar3 = Begin("Example: Auto-resizing window",&ShowDemoWindow::show_app_auto_resize,0x40);
    if (bVar3) {
      TextUnformatted("Window will resize every-frame to the size of its content.\nNote that you probably don\'t want to query the window size to\noutput your content because that would create a feedback loop."
                      ,(char *)0x0);
      SliderInt("Number of lines",&ShowExampleAppAutoResize(bool*)::lines,1,0x14,"%d",0);
      uVar32 = 0;
      for (iVar21 = 0; iVar21 < ShowExampleAppAutoResize(bool*)::lines; iVar21 = iVar21 + 1) {
        Text("%*sThis is line %d",uVar32,"");
        uVar32 = (ulong)((int)uVar32 + 4);
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_constrained_resize == true) {
    local_a8 = "Custom: Fixed Steps (100)";
    local_b8 = "Height 400-500";
    pcStack_b0 = "Custom: Always Square";
    local_c8 = (ImVec2)0x1c0deb;
    IStack_c0 = (ImVec2)0x1c0e05;
    doc = (MyDocument *)anon_var_dwarf_3d993;
    IStack_d0 = (ImVec2)0x1c0dd4;
    if (ShowExampleAppConstrainedResize(bool*)::type == 0) {
      canvas_sz.x = -1.0;
      canvas_sz.y = 0.0;
      gradient_size.x = -1.0;
      gradient_size.y = 3.4028235e+38;
      SetNextWindowSizeConstraints(&canvas_sz,&gradient_size,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 1) {
      canvas_sz.x = 0.0;
      canvas_sz.y = -1.0;
      gradient_size.x = 3.4028235e+38;
      gradient_size.y = -1.0;
      SetNextWindowSizeConstraints(&canvas_sz,&gradient_size,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 2) {
      canvas_sz.x = 100.0;
      canvas_sz.y = 100.0;
      gradient_size.x = 3.4028235e+38;
      gradient_size.y = 3.4028235e+38;
      SetNextWindowSizeConstraints(&canvas_sz,&gradient_size,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 3) {
      canvas_sz.x = 400.0;
      canvas_sz.y = -1.0;
      gradient_size.x = 500.0;
      gradient_size.y = -1.0;
      SetNextWindowSizeConstraints(&canvas_sz,&gradient_size,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 4) {
      canvas_sz.x = -1.0;
      canvas_sz.y = 400.0;
      gradient_size.x = -1.0;
      gradient_size.y = 500.0;
      SetNextWindowSizeConstraints(&canvas_sz,&gradient_size,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 5) {
      canvas_sz.x = 0.0;
      canvas_sz.y = 0.0;
      gradient_size.x = 3.4028235e+38;
      gradient_size.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                (&canvas_sz,&gradient_size,
                 ShowExampleAppConstrainedResize::CustomConstraints::Square,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 6) {
      canvas_sz.x = 0.0;
      canvas_sz.y = 0.0;
      gradient_size.x = 3.4028235e+38;
      gradient_size.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                (&canvas_sz,&gradient_size,ShowExampleAppConstrainedResize::CustomConstraints::Step,
                 (void *)0x64);
    }
    bVar3 = Begin("Example: Constrained Resize",&ShowDemoWindow::show_app_constrained_resize,
                  (uint)ShowExampleAppConstrainedResize(bool*)::auto_resize << 6);
    if (bVar3) {
      canvas_sz.x = 0.0;
      canvas_sz.y = 0.0;
      bVar3 = Button("200x200",&canvas_sz);
      if (bVar3) {
        canvas_sz.x = 200.0;
        canvas_sz.y = 200.0;
        SetWindowSize(&canvas_sz,0);
      }
      SameLine(0.0,-1.0);
      canvas_sz.x = 0.0;
      canvas_sz.y = 0.0;
      bVar3 = Button("500x500",&canvas_sz);
      if (bVar3) {
        canvas_sz.x = 500.0;
        canvas_sz.y = 500.0;
        SetWindowSize(&canvas_sz,0);
      }
      SameLine(0.0,-1.0);
      canvas_sz.x = 0.0;
      canvas_sz.y = 0.0;
      bVar3 = Button("800x200",&canvas_sz);
      if (bVar3) {
        canvas_sz.x = 800.0;
        canvas_sz.y = 200.0;
        SetWindowSize(&canvas_sz,0);
      }
      SetNextItemWidth(200.0);
      Combo("Constraint",&ShowExampleAppConstrainedResize(bool*)::type,(char **)&doc,7,-1);
      SetNextItemWidth(200.0);
      DragInt("Lines",&ShowExampleAppConstrainedResize(bool*)::display_lines,0.2,1,100,"%d",0);
      Checkbox("Auto-resize",(bool *)&ShowExampleAppConstrainedResize(bool*)::auto_resize);
      uVar6 = 0;
      for (iVar21 = 0; iVar21 < ShowExampleAppConstrainedResize(bool*)::display_lines;
          iVar21 = iVar21 + 1) {
        Text("%*sHello, sailor! Making this line long enough for the example.",(ulong)uVar6,"");
        uVar6 = uVar6 + 4;
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_simple_overlay == true) {
    pIVar16 = GetIO();
    if (ShowExampleAppSimpleOverlay(bool*)::corner == 0xffffffff) {
      flags = 0xc116b;
    }
    else {
      uVar32 = CONCAT44(-(uint)((ShowExampleAppSimpleOverlay(bool*)::corner & 2) == 0),
                        -(uint)((ShowExampleAppSimpleOverlay(bool*)::corner & 1) == 0));
      doc = (MyDocument *)
            ((ulong)DAT_001b5fe0 & uVar32 |
            ~uVar32 & CONCAT44((pIVar16->DisplaySize).y + -10.0,(pIVar16->DisplaySize).x + -10.0));
      uVar32 = ~uVar32 & DAT_001b0150;
      canvas_sz.x = (float)uVar32;
      canvas_sz.y = (float)(uVar32 >> 0x20);
      SetNextWindowPos((ImVec2 *)&doc,1,&canvas_sz);
      flags = 0xc116f;
    }
    SetNextWindowBgAlpha(0.35);
    bVar3 = Begin("Example: Simple overlay",&ShowDemoWindow::show_app_simple_overlay,flags);
    if (bVar3) {
      Text("Simple overlay\nin the corner of the screen.\n(right-click to change position)");
      Separator();
      bVar3 = IsMousePosValid((ImVec2 *)0x0);
      if (bVar3) {
        Text("Mouse Position: (%.1f,%.1f)",(double)(pIVar16->MousePos).x);
      }
      else {
        Text("Mouse Position: <invalid>");
      }
      bVar3 = BeginPopupContextWindow((char *)0x0,1);
      if (bVar3) {
        bVar3 = MenuItem("Custom",(char *)0x0,
                         ShowExampleAppSimpleOverlay(bool*)::corner == 0xffffffff,true);
        uVar6 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar3) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0xffffffff;
        }
        bVar3 = MenuItem("Top-left",(char *)0x0,!bVar3 && uVar6 == 0,true);
        uVar6 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar3) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0;
        }
        bVar3 = MenuItem("Top-right",(char *)0x0,!bVar3 && uVar6 == 1,true);
        uVar6 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar3) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 1;
        }
        bVar3 = MenuItem("Bottom-left",(char *)0x0,!bVar3 && uVar6 == 2,true);
        uVar6 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar3) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 2;
        }
        bVar3 = MenuItem("Bottom-right",(char *)0x0,!bVar3 && uVar6 == 3,true);
        if (bVar3) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 3;
        }
        bVar3 = MenuItem("Close",(char *)0x0,false,true);
        if (bVar3) {
          ShowDemoWindow::show_app_simple_overlay = false;
        }
        EndPopup();
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_window_titles == true) {
    doc = (MyDocument *)0x42c8000042c80000;
    canvas_sz.x = 0.0;
    canvas_sz.y = 0.0;
    SetNextWindowPos((ImVec2 *)&doc,4,&canvas_sz);
    Begin("Same title as another window##1",(bool *)0x0,0);
    Text("This is window 1.\nMy title is the same as window 2, but my identifier is unique.");
    End();
    doc = (MyDocument *)0x4348000042c80000;
    canvas_sz.x = 0.0;
    canvas_sz.y = 0.0;
    SetNextWindowPos((ImVec2 *)&doc,4,&canvas_sz);
    Begin("Same title as another window##2",(bool *)0x0,0);
    Text("This is window 2.\nMy title is the same as window 1, but my identifier is unique.");
    End();
    dVar30 = GetTime();
    cVar1 = "|/-\\"[(int)(dVar30 * 4.0) & 3];
    GetFrameCount();
    sprintf((char *)&doc,"Animated title %c %d###AnimatedTitle",(ulong)(uint)(int)cVar1);
    canvas_sz.x = 100.0;
    canvas_sz.y = 300.0;
    gradient_size.x = 0.0;
    gradient_size.y = 0.0;
    SetNextWindowPos(&canvas_sz,4,&gradient_size);
    Begin((char *)&doc,(bool *)0x0,0);
    Text("This window has a changing title.");
    End();
  }
  if (ShowDemoWindow::show_app_custom_rendering != true) goto LAB_0012e81b;
  bVar3 = Begin("Example: Custom rendering",&ShowDemoWindow::show_app_custom_rendering,0);
  if ((bVar3) && (bVar3 = BeginTabBar("##TabBar",0), bVar3)) {
    bVar3 = BeginTabItem("Primitives",(bool *)0x0,0);
    local_50 = p_open;
    if (bVar3) {
      fVar27 = GetFontSize();
      PushItemWidth(fVar27 * -15.0);
      pIVar17 = GetWindowDrawList();
      iVar21 = 0;
      Text("Gradients");
      fVar27 = CalcItemWidth();
      local_128._0_4_ = GetFrameHeight();
      local_128._4_4_ = extraout_XMM0_Db;
      uStack_120._0_4_ = extraout_XMM0_Dc;
      uStack_120._4_4_ = extraout_XMM0_Dd;
      gradient_size.y = (float)local_128._0_4_;
      gradient_size.x = fVar27;
      doc = (MyDocument *)GetCursorScreenPos();
      canvas_sz.x = fVar27 + SUB84(doc,0);
      canvas_sz.y = (float)local_128._0_4_ + SUB84(doc,4);
      IVar7 = GetColorU32(0xff000000);
      IVar8 = GetColorU32(0xffffffff);
      ImDrawList::AddRectFilledMultiColor(pIVar17,(ImVec2 *)&doc,&canvas_sz,IVar7,IVar8,IVar8,IVar7)
      ;
      InvisibleButton("##gradient1",&gradient_size,0);
      doc = (MyDocument *)GetCursorScreenPos();
      canvas_sz.x = gradient_size.x + SUB84(doc,0);
      canvas_sz.y = gradient_size.y + SUB84(doc,4);
      IVar7 = GetColorU32(0xff00ff00);
      IVar8 = GetColorU32(0xff0000ff);
      ImDrawList::AddRectFilledMultiColor(pIVar17,(ImVec2 *)&doc,&canvas_sz,IVar7,IVar8,IVar8,IVar7)
      ;
      InvisibleButton("##gradient2",&gradient_size,0);
      Text("All primitives");
      if ((ShowExampleAppCustomRendering(bool*)::colf == '\0') &&
         (iVar23 = __cxa_guard_acquire(&ShowExampleAppCustomRendering(bool*)::colf), iVar23 != 0)) {
        ShowExampleAppCustomRendering(bool*)::colf._0_8_ = 0x3f8000003f800000;
        ShowExampleAppCustomRendering(bool*)::colf._8_8_ = 0x3f8000003ecccccd;
        __cxa_guard_release(&ShowExampleAppCustomRendering(bool*)::colf);
      }
      DragFloat("Size",&ShowExampleAppCustomRendering(bool*)::sz,0.2,2.0,72.0,"%.0f",0);
      DragFloat("Thickness",&ShowExampleAppCustomRendering(bool*)::thickness,0.05,1.0,8.0,"%.02f",0)
      ;
      SliderInt("N-gon sides",&ShowExampleAppCustomRendering(bool*)::ngon_sides,3,0xc,"%d",0);
      Checkbox("##circlesegmentoverride",
               (bool *)&ShowExampleAppCustomRendering(bool*)::circle_segments_override);
      pIVar18 = GetStyle();
      SameLine(0.0,(pIVar18->ItemInnerSpacing).x);
      bVar3 = SliderInt("Circle segments override",
                        &ShowExampleAppCustomRendering(bool*)::circle_segments_override_v,3,0x28,
                        "%d",0);
      ShowExampleAppCustomRendering(bool*)::circle_segments_override =
           ShowExampleAppCustomRendering(bool*)::circle_segments_override | bVar3;
      Checkbox("##curvessegmentoverride",
               (bool *)&ShowExampleAppCustomRendering(bool*)::curve_segments_override);
      pIVar18 = GetStyle();
      SameLine(0.0,(pIVar18->ItemInnerSpacing).x);
      bVar3 = SliderInt("Curves segments override",
                        &ShowExampleAppCustomRendering(bool*)::curve_segments_override_v,3,0x28,"%d"
                        ,0);
      ShowExampleAppCustomRendering(bool*)::curve_segments_override =
           ShowExampleAppCustomRendering(bool*)::curve_segments_override | bVar3;
      ColorEdit4("Color",(float *)ShowExampleAppCustomRendering(bool*)::colf,0);
      IVar31 = GetCursorScreenPos();
      doc = (MyDocument *)ShowExampleAppCustomRendering(bool*)::colf._0_8_;
      IStack_d0.x = (float)ShowExampleAppCustomRendering(bool*)::colf._8_4_;
      IStack_d0.y = (float)ShowExampleAppCustomRendering(bool*)::colf._12_4_;
      IVar7 = ColorConvertFloat4ToU32((ImVec4 *)&doc);
      local_dc = 0;
      if (ShowExampleAppCustomRendering(bool*)::circle_segments_override != 0) {
        local_dc = ShowExampleAppCustomRendering(bool*)::circle_segments_override_v;
      }
      iVar23 = 0;
      if (ShowExampleAppCustomRendering(bool*)::curve_segments_override != 0) {
        iVar23 = ShowExampleAppCustomRendering(bool*)::curve_segments_override_v;
      }
      local_158 = IVar31.x;
      fStack_154 = IVar31.y;
      uStack_14c = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
      local_48.x = local_158 + 4.0;
      local_48.y = fStack_154;
      uStack_40._0_4_ = (undefined4)extraout_XMM0_Qb;
      uStack_40._4_4_ = uStack_14c;
      fVar27 = fStack_154 + 4.0;
      for (; iVar21 != 2; iVar21 = iVar21 + 1) {
        fVar29 = 1.0;
        if (iVar21 != 0) {
          fVar29 = ShowExampleAppCustomRendering(bool*)::thickness;
        }
        local_128._0_4_ = fVar29;
        fVar28 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
        doc = (MyDocument *)CONCAT44(fVar28 + fVar27,fVar28 + local_48.x);
        ImDrawList::AddNgon(pIVar17,(ImVec2 *)&doc,fVar28,IVar7,
                            ShowExampleAppCustomRendering(bool*)::ngon_sides,fVar29);
        fVar28 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_48.x;
        fVar29 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
        doc = (MyDocument *)CONCAT44(fVar29 + fVar27,fVar29 + fVar28);
        ImDrawList::AddCircle(pIVar17,(ImVec2 *)&doc,fVar29,IVar7,local_dc,(float)local_128._0_4_);
        fVar28 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar28;
        doc = (MyDocument *)CONCAT44(fVar27,fVar28);
        canvas_sz.x = fVar28 + ShowExampleAppCustomRendering(bool*)::sz;
        canvas_sz.y = fVar27 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRect(pIVar17,(ImVec2 *)&doc,&canvas_sz,IVar7,0.0,0,(float)local_128._0_4_);
        fVar28 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar28;
        doc = (MyDocument *)CONCAT44(fVar27,fVar28);
        canvas_sz.x = fVar28 + ShowExampleAppCustomRendering(bool*)::sz;
        canvas_sz.y = fVar27 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRect(pIVar17,(ImVec2 *)&doc,&canvas_sz,IVar7,10.0,0xf,(float)local_128._0_4_)
        ;
        fVar28 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar28;
        doc = (MyDocument *)CONCAT44(fVar27,fVar28);
        canvas_sz.x = fVar28 + ShowExampleAppCustomRendering(bool*)::sz;
        canvas_sz.y = fVar27 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRect(pIVar17,(ImVec2 *)&doc,&canvas_sz,IVar7,10.0,9,(float)local_128._0_4_);
        fVar28 = fVar28 + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
        canvas_sz.y = ShowExampleAppCustomRendering(bool*)::sz + fVar27 + -0.5;
        doc = (MyDocument *)CONCAT44(fVar27,ShowExampleAppCustomRendering(bool*)::sz * 0.5 + fVar28)
        ;
        canvas_sz.x = ShowExampleAppCustomRendering(bool*)::sz + fVar28;
        local_58.y = canvas_sz.y;
        local_58.x = fVar28;
        ImDrawList::AddTriangle
                  (pIVar17,(ImVec2 *)&doc,&canvas_sz,&local_58,IVar7,(float)local_128._0_4_);
        fVar28 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar28;
        doc = (MyDocument *)CONCAT44(fVar27,fVar28);
        canvas_sz.x = ShowExampleAppCustomRendering(bool*)::sz + fVar28;
        canvas_sz.y = fVar27;
        ImDrawList::AddLine(pIVar17,(ImVec2 *)&doc,&canvas_sz,IVar7,(float)local_128._0_4_);
        fVar28 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar28;
        canvas_sz.y = ShowExampleAppCustomRendering(bool*)::sz + fVar27;
        doc = (MyDocument *)CONCAT44(fVar27,fVar28);
        canvas_sz.x = fVar28;
        ImDrawList::AddLine(pIVar17,(ImVec2 *)&doc,&canvas_sz,IVar7,(float)local_128._0_4_);
        fVar28 = fVar28 + 10.0;
        doc = (MyDocument *)CONCAT44(fVar27,fVar28);
        canvas_sz.x = ShowExampleAppCustomRendering(bool*)::sz + fVar28;
        canvas_sz.y = ShowExampleAppCustomRendering(bool*)::sz + fVar27;
        ImDrawList::AddLine(pIVar17,(ImVec2 *)&doc,&canvas_sz,IVar7,(float)local_128._0_4_);
        fVar28 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar28;
        local_140.y = ShowExampleAppCustomRendering(bool*)::sz * -0.4 + fVar27;
        canvas_sz.y = ShowExampleAppCustomRendering(bool*)::sz * 0.6 + fVar27;
        local_140.x = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + fVar28;
        local_138[0].y = fVar27 + ShowExampleAppCustomRendering(bool*)::sz;
        local_138[0].x = fVar28 + ShowExampleAppCustomRendering(bool*)::sz;
        canvas_sz.x = fVar28;
        ImDrawList::AddBezierQuadratic
                  (pIVar17,&canvas_sz,&local_140,local_138,IVar7,(float)local_128._0_4_,iVar23);
        fVar28 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar28;
        doc = (MyDocument *)CONCAT44(fVar27,fVar28);
        IStack_d0.y = ShowExampleAppCustomRendering(bool*)::sz * 0.3 + fVar27;
        IStack_d0.x = ShowExampleAppCustomRendering(bool*)::sz * 1.3 + fVar28;
        local_c8.y = -ShowExampleAppCustomRendering(bool*)::sz * 0.3 +
                     fVar27 + ShowExampleAppCustomRendering(bool*)::sz;
        local_c8.x = -ShowExampleAppCustomRendering(bool*)::sz * 1.3 +
                     ShowExampleAppCustomRendering(bool*)::sz + fVar28;
        IStack_c0.y = fVar27 + ShowExampleAppCustomRendering(bool*)::sz;
        IStack_c0.x = ShowExampleAppCustomRendering(bool*)::sz + fVar28;
        ImDrawList::AddBezierCubic
                  (pIVar17,(ImVec2 *)&doc,&IStack_d0,&local_c8,&IStack_c0,IVar7,
                   (float)local_128._0_4_,iVar23);
        fVar27 = fVar27 + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
      }
      fVar29 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
      doc = (MyDocument *)CONCAT44(fVar29 + fVar27,fVar29 + local_48.x);
      ImDrawList::AddNgonFilled
                (pIVar17,(ImVec2 *)&doc,fVar29,IVar7,
                 ShowExampleAppCustomRendering(bool*)::ngon_sides);
      local_48.x = local_48.x + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
      fVar29 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
      doc = (MyDocument *)CONCAT44(fVar29 + fVar27,fVar29 + local_48.x);
      ImDrawList::AddCircleFilled(pIVar17,(ImVec2 *)&doc,fVar29,IVar7,local_dc);
      fVar29 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_48.x;
      _local_128 = ZEXT416((uint)fVar29);
      doc = (MyDocument *)CONCAT44(fVar27,fVar29);
      canvas_sz.x = fVar29 + ShowExampleAppCustomRendering(bool*)::sz;
      canvas_sz.y = fVar27 + ShowExampleAppCustomRendering(bool*)::sz;
      ImDrawList::AddRectFilled(pIVar17,(ImVec2 *)&doc,&canvas_sz,IVar7,0.0,0xf);
      fVar29 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
      _local_128 = ZEXT416((uint)fVar29);
      doc = (MyDocument *)CONCAT44(fVar27,fVar29);
      canvas_sz.x = fVar29 + ShowExampleAppCustomRendering(bool*)::sz;
      canvas_sz.y = fVar27 + ShowExampleAppCustomRendering(bool*)::sz;
      ImDrawList::AddRectFilled(pIVar17,(ImVec2 *)&doc,&canvas_sz,IVar7,10.0,0xf);
      fVar29 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
      _local_128 = ZEXT416((uint)fVar29);
      doc = (MyDocument *)CONCAT44(fVar27,fVar29);
      canvas_sz.x = fVar29 + ShowExampleAppCustomRendering(bool*)::sz;
      canvas_sz.y = fVar27 + ShowExampleAppCustomRendering(bool*)::sz;
      ImDrawList::AddRectFilled(pIVar17,(ImVec2 *)&doc,&canvas_sz,IVar7,10.0,9);
      local_128._0_4_ = (float)local_128._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
      canvas_sz.y = ShowExampleAppCustomRendering(bool*)::sz + fVar27 + -0.5;
      local_128._4_4_ = canvas_sz.y;
      uStack_120._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 0.0 + 0.0;
      uStack_120._4_4_ = ShowExampleAppCustomRendering(bool*)::sz + fStack_154 + 0.0;
      doc = (MyDocument *)
            CONCAT44(fVar27,ShowExampleAppCustomRendering(bool*)::sz * 0.5 + (float)local_128._0_4_)
      ;
      canvas_sz.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_128._0_4_;
      local_58.y = canvas_sz.y;
      local_58.x = (float)local_128._0_4_;
      ImDrawList::AddTriangleFilled(pIVar17,(ImVec2 *)&doc,&canvas_sz,&local_58,IVar7);
      fVar29 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
      _local_128 = ZEXT416((uint)fVar29);
      doc = (MyDocument *)CONCAT44(fVar27,fVar29);
      canvas_sz.x = fVar29 + ShowExampleAppCustomRendering(bool*)::sz;
      canvas_sz.y = ShowExampleAppCustomRendering(bool*)::thickness + fVar27;
      ImDrawList::AddRectFilled(pIVar17,(ImVec2 *)&doc,&canvas_sz,IVar7,0.0,0xf);
      fVar29 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
      _local_128 = ZEXT416((uint)fVar29);
      doc = (MyDocument *)CONCAT44(fVar27,fVar29);
      canvas_sz.x = ShowExampleAppCustomRendering(bool*)::thickness + fVar29;
      canvas_sz.y = ShowExampleAppCustomRendering(bool*)::sz + fVar27;
      ImDrawList::AddRectFilled(pIVar17,(ImVec2 *)&doc,&canvas_sz,IVar7,0.0,0xf);
      local_128._0_4_ = (float)local_128._0_4_ + 20.0;
      doc = (MyDocument *)CONCAT44(fVar27,local_128._0_4_);
      canvas_sz.x = (float)local_128._0_4_ + 1.0;
      canvas_sz.y = fVar27 + 1.0;
      ImDrawList::AddRectFilled(pIVar17,(ImVec2 *)&doc,&canvas_sz,IVar7,0.0,0xf);
      doc = (MyDocument *)
            CONCAT44(fVar27,(float)local_128._0_4_ + ShowExampleAppCustomRendering(bool*)::sz);
      canvas_sz.x = (float)local_128._0_4_ + ShowExampleAppCustomRendering(bool*)::sz +
                    ShowExampleAppCustomRendering(bool*)::sz;
      canvas_sz.y = fVar27 + ShowExampleAppCustomRendering(bool*)::sz;
      ImDrawList::AddRectFilledMultiColor
                (pIVar17,(ImVec2 *)&doc,&canvas_sz,0xff000000,0xff0000ff,0xff00ffff,0xff00ff00);
      doc = (MyDocument *)
            CONCAT44((ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 3.0,
                     (ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 10.2);
      Dummy((ImVec2 *)&doc);
      PopItemWidth();
      EndTabItem();
    }
    p_open = local_50;
    bVar3 = BeginTabItem("Canvas",(bool *)0x0,0);
    if (bVar3) {
      if ((ShowExampleAppCustomRendering(bool*)::points == '\0') &&
         (iVar21 = __cxa_guard_acquire(&ShowExampleAppCustomRendering(bool*)::points), iVar21 != 0))
      {
        _points = 0;
        uRam000000000022ce30 = 0;
        __cxa_atexit(ImVector<ImVec2>::~ImVector,&ShowExampleAppCustomRendering(bool*)::points,
                     &__dso_handle);
        __cxa_guard_release(&ShowExampleAppCustomRendering(bool*)::points);
      }
      if ((ShowExampleAppCustomRendering(bool*)::scrolling == '\0') &&
         (iVar21 = __cxa_guard_acquire(&ShowExampleAppCustomRendering(bool*)::scrolling),
         iVar21 != 0)) {
        _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0 = 0.0;
        _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1 = 0.0;
        __cxa_guard_release(&ShowExampleAppCustomRendering(bool*)::scrolling);
      }
      Checkbox("Enable grid",(bool *)&ShowExampleAppCustomRendering(bool*)::opt_enable_grid);
      Checkbox("Enable context menu",
               (bool *)&ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu);
      Text("Mouse Left: drag to add lines,\nMouse Right: drag to scroll, click for context menu.");
      doc = (MyDocument *)GetCursorScreenPos();
      IVar31 = GetContentRegionAvail();
      canvas_sz.x = IVar31.x;
      canvas_sz.y = IVar31.y;
      if (canvas_sz.x < 50.0) {
        canvas_sz.x = 50.0;
        IVar31.x = 50.0;
        IVar31.y = 0.0;
      }
      if (canvas_sz.y < 50.0) {
        canvas_sz.y = 50.0;
      }
      gradient_size.x = SUB84(doc,0) + IVar31.x;
      gradient_size.y = (float)((ulong)doc >> 0x20) + canvas_sz.y;
      pIVar16 = GetIO();
      pIVar17 = GetWindowDrawList();
      ImDrawList::AddRectFilled(pIVar17,(ImVec2 *)&doc,&gradient_size,0xff323232,0.0,0xf);
      ImDrawList::AddRect(pIVar17,(ImVec2 *)&doc,&gradient_size,0xffffffff,0.0,0xf,1.0);
      InvisibleButton("canvas",&canvas_sz,3);
      bVar3 = IsItemHovered(0);
      bVar4 = IsItemActive();
      fVar27 = _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0 + SUB84(doc,0);
      fVar29 = _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1 + (float)((ulong)doc >> 0x20);
      local_58.x = (pIVar16->MousePos).x - fVar27;
      local_58.y = (pIVar16->MousePos).y - fVar29;
      if (bVar3) {
        if (ShowExampleAppCustomRendering(bool*)::adding_line == '\0') {
          bVar3 = IsMouseClicked(0,false);
          if (!bVar3) goto LAB_0012e353;
          ImVector<ImVec2>::push_back
                    ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_58);
          ImVector<ImVec2>::push_back
                    ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_58);
          ShowExampleAppCustomRendering(bool*)::adding_line = '\x01';
        }
LAB_0012e35c:
        pIVar19 = ImVector<ImVec2>::back
                            ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points);
        *pIVar19 = local_58;
        bVar3 = IsMouseDown(0);
        if (!bVar3) {
          ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
        }
      }
      else {
LAB_0012e353:
        if (ShowExampleAppCustomRendering(bool*)::adding_line == '\x01') goto LAB_0012e35c;
      }
      if (bVar4) {
        if (ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu == '\0') {
          fVar28 = 0.0;
        }
        else {
          fVar28 = -1.0;
        }
        bVar3 = IsMouseDragging(1,fVar28);
        if (bVar3) {
          _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0 =
               (pIVar16->MouseDelta).x + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0;
          _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1 =
               (pIVar16->MouseDelta).y + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1;
        }
      }
      IVar31 = GetMouseDragDelta(1,-1.0);
      if (ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu == '\x01') {
        uStack_120 = extraout_XMM0_Qb_00;
        local_128._0_4_ = IVar31.x;
        local_128._4_4_ = IVar31.y;
        bVar3 = IsMouseReleased(1);
        if ((((bVar3) && ((float)local_128._0_4_ == 0.0)) && ((float)local_128._4_4_ == 0.0)) &&
           (!NAN((float)local_128._4_4_))) {
          OpenPopupOnItemClick("context",1);
        }
      }
      bVar3 = BeginPopup("context",0);
      if (bVar3) {
        if (ShowExampleAppCustomRendering(bool*)::adding_line == '\x01') {
          ImVector<ImVec2>::resize
                    ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,
                     ShowExampleAppCustomRendering(bool*)::points + -2);
        }
        ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
        bVar3 = MenuItem("Remove one",(char *)0x0,false,
                         0 < ShowExampleAppCustomRendering(bool*)::points);
        if (bVar3) {
          ImVector<ImVec2>::resize
                    ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,
                     ShowExampleAppCustomRendering(bool*)::points + -2);
        }
        bVar3 = MenuItem("Remove all",(char *)0x0,false,
                         0 < ShowExampleAppCustomRendering(bool*)::points);
        if (bVar3) {
          ImVector<ImVec2>::clear((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points)
          ;
        }
        EndPopup();
      }
      ImDrawList::PushClipRect(pIVar17,(ImVec2)doc,gradient_size,true);
      if (ShowExampleAppCustomRendering(bool*)::opt_enable_grid == '\x01') {
        fVar28 = fmodf(_ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0,64.0);
        while (fVar28 < canvas_sz.x) {
          local_128._0_4_ = fVar28;
          local_e8.y = doc._4_4_;
          local_e8.x = doc._0_4_ + fVar28;
          local_f0.y = gradient_size.y;
          local_f0.x = doc._0_4_ + fVar28;
          ImDrawList::AddLine(pIVar17,&local_e8,&local_f0,0x28c8c8c8,1.0);
          fVar28 = (float)local_128._0_4_ + 64.0;
        }
        fVar28 = fmodf(_ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1,64.0);
        while (fVar28 < canvas_sz.y) {
          local_e8.y = doc._4_4_ + fVar28;
          local_e8.x = SUB84(doc,0);
          local_f0.y = doc._4_4_ + fVar28;
          local_f0.x = gradient_size.x;
          local_128._0_4_ = fVar28;
          ImDrawList::AddLine(pIVar17,&local_e8,&local_f0,0x28c8c8c8,1.0);
          fVar28 = (float)local_128._0_4_ + 64.0;
        }
      }
      for (iVar21 = 0; iVar21 < ShowExampleAppCustomRendering(bool*)::points; iVar21 = iVar21 + 2) {
        pIVar19 = ImVector<ImVec2>::operator[]
                            ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,
                             iVar21);
        _local_128 = ZEXT416((uint)pIVar19->x);
        pIVar19 = ImVector<ImVec2>::operator[]
                            ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,
                             iVar21);
        local_e8.x = (float)local_128._0_4_ + fVar27;
        local_e8.y = pIVar19->y + fVar29;
        pIVar19 = ImVector<ImVec2>::operator[]
                            ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,
                             iVar21 + 1);
        _local_128 = ZEXT416((uint)pIVar19->x);
        pIVar19 = ImVector<ImVec2>::operator[]
                            ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,
                             iVar21 + 1);
        local_f0.x = (float)local_128._0_4_ + fVar27;
        local_f0.y = pIVar19->y + fVar29;
        ImDrawList::AddLine(pIVar17,&local_e8,&local_f0,0xff00ffff,2.0);
      }
      ImDrawList::PopClipRect(pIVar17);
      EndTabItem();
      p_open = local_50;
    }
    bVar3 = BeginTabItem("BG/FG draw lists",(bool *)0x0,0);
    if (bVar3) {
      Checkbox("Draw in Background draw list",(bool *)&ShowExampleAppCustomRendering(bool*)::draw_bg
              );
      SameLine(0.0,-1.0);
      HelpMarker("The Background draw list will be rendered below every Dear ImGui windows.");
      Checkbox("Draw in Foreground draw list",(bool *)&ShowExampleAppCustomRendering(bool*)::draw_fg
              );
      SameLine(0.0,-1.0);
      HelpMarker("The Foreground draw list will be rendered over every Dear ImGui windows.");
      IVar31 = GetWindowPos();
      uStack_120 = extraout_XMM0_Qb_01;
      local_128._0_4_ = IVar31.x;
      local_128._4_4_ = IVar31.y;
      IVar31 = GetWindowSize();
      doc = (MyDocument *)
            CONCAT44(IVar31.y * 0.5 + (float)local_128._4_4_,IVar31.x * 0.5 + (float)local_128._0_4_
                    );
      if (ShowExampleAppCustomRendering(bool*)::draw_bg == '\x01') {
        pIVar17 = GetBackgroundDrawList();
        ImDrawList::AddCircle(pIVar17,(ImVec2 *)&doc,IVar31.x * 0.6,0xc80000ff,0,14.0);
      }
      if (ShowExampleAppCustomRendering(bool*)::draw_fg == '\x01') {
        pIVar17 = GetForegroundDrawList();
        ImDrawList::AddCircle(pIVar17,(ImVec2 *)&doc,IVar31.y * 0.6,0xc800ff00,0,10.0);
      }
      EndTabItem();
    }
    EndTabBar();
  }
  End();
LAB_0012e81b:
  if (ShowDemoWindow::show_app_metrics == true) {
    ShowMetricsWindow(&ShowDemoWindow::show_app_metrics);
  }
  if (ShowDemoWindow::show_app_about == true) {
    ShowAboutWindow(&ShowDemoWindow::show_app_about);
  }
  if (ShowDemoWindow::show_app_style_editor == true) {
    Begin("Dear ImGui Style Editor",&ShowDemoWindow::show_app_style_editor,0);
    ShowStyleEditor((ImGuiStyle *)0x0);
    End();
  }
  uVar6 = ShowDemoWindow::no_titlebar + 8;
  if (ShowDemoWindow::no_scrollbar == false) {
    uVar6 = (uint)ShowDemoWindow::no_titlebar;
  }
  uVar9 = uVar6 + 0x400;
  if (ShowDemoWindow::no_menu != false) {
    uVar9 = uVar6;
  }
  uVar6 = uVar9 + 4;
  if (ShowDemoWindow::no_move == false) {
    uVar6 = uVar9;
  }
  uVar9 = uVar6 | 2;
  if (ShowDemoWindow::no_resize == false) {
    uVar9 = uVar6;
  }
  uVar6 = uVar9 | 0x20;
  if (ShowDemoWindow::no_collapse == false) {
    uVar6 = uVar9;
  }
  uVar9 = uVar6 | 0xc0000;
  if (ShowDemoWindow::no_nav == false) {
    uVar9 = uVar6;
  }
  uVar6 = uVar9 | 0x80;
  if (ShowDemoWindow::no_background == false) {
    uVar6 = uVar9;
  }
  uVar9 = uVar6 | 0x2000;
  if (ShowDemoWindow::no_bring_to_front == false) {
    uVar9 = uVar6;
  }
  if (ShowDemoWindow::no_close != false) {
    p_open = (bool *)0x0;
  }
  doc = (MyDocument *)0x41a0000044228000;
  canvas_sz.x = 0.0;
  canvas_sz.y = 0.0;
  SetNextWindowPos((ImVec2 *)&doc,4,&canvas_sz);
  doc = (MyDocument *)0x442a000044098000;
  SetNextWindowSize((ImVec2 *)&doc,4);
  bVar3 = Begin("Dear ImGui Demo",p_open,uVar9);
  if (bVar3) {
    fVar27 = GetFontSize();
    PushItemWidth(fVar27 * -12.0);
    bVar3 = BeginMenuBar();
    if (bVar3) {
      bVar3 = BeginMenu("Menu",true);
      if (bVar3) {
        ShowExampleMenuFile();
        EndMenu();
      }
      bVar3 = BeginMenu("Examples",true);
      if (bVar3) {
        MenuItem("Main menu bar",(char *)0x0,&ShowDemoWindow::show_app_main_menu_bar,true);
        MenuItem("Console",(char *)0x0,&ShowDemoWindow::show_app_console,true);
        MenuItem("Log",(char *)0x0,&ShowDemoWindow::show_app_log,true);
        MenuItem("Simple layout",(char *)0x0,&ShowDemoWindow::show_app_layout,true);
        MenuItem("Property editor",(char *)0x0,&ShowDemoWindow::show_app_property_editor,true);
        MenuItem("Long text display",(char *)0x0,&ShowDemoWindow::show_app_long_text,true);
        MenuItem("Auto-resizing window",(char *)0x0,&ShowDemoWindow::show_app_auto_resize,true);
        MenuItem("Constrained-resizing window",(char *)0x0,
                 &ShowDemoWindow::show_app_constrained_resize,true);
        MenuItem("Simple overlay",(char *)0x0,&ShowDemoWindow::show_app_simple_overlay,true);
        MenuItem("Manipulating window titles",(char *)0x0,&ShowDemoWindow::show_app_window_titles,
                 true);
        MenuItem("Custom rendering",(char *)0x0,&ShowDemoWindow::show_app_custom_rendering,true);
        MenuItem("Documents",(char *)0x0,&ShowDemoWindow::show_app_documents,true);
        EndMenu();
      }
      bVar3 = BeginMenu("Tools",true);
      if (bVar3) {
        MenuItem("Metrics/Debugger",(char *)0x0,&ShowDemoWindow::show_app_metrics,true);
        MenuItem("Style Editor",(char *)0x0,&ShowDemoWindow::show_app_style_editor,true);
        MenuItem("About Dear ImGui",(char *)0x0,&ShowDemoWindow::show_app_about,true);
        EndMenu();
      }
      EndMenuBar();
    }
    Text("dear imgui says hello. (%s)");
    Spacing();
    bVar3 = CollapsingHeader("Help",0);
    if (bVar3) {
      Text("ABOUT THIS DEMO:");
      BulletText("Sections below are demonstrating many aspects of the library.");
      BulletText("The \"Examples\" menu above leads to more demo contents.");
      BulletText(
                "The \"Tools\" menu above gives access to: About Box, Style Editor,\nand Metrics/Debugger (general purpose Dear ImGui debugging tool)."
                );
      Separator();
      Text("PROGRAMMER GUIDE:");
      BulletText("See the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
      BulletText("See comments in imgui.cpp.");
      BulletText("See example applications in the examples/ folder.");
      BulletText("Read the FAQ at http://www.dearimgui.org/faq/");
      BulletText("Set \'io.ConfigFlags |= NavEnableKeyboard\' for keyboard controls.");
      BulletText("Set \'io.ConfigFlags |= NavEnableGamepad\' for gamepad controls.");
      Separator();
      Text("USER GUIDE:");
      ShowUserGuide();
    }
    bVar3 = CollapsingHeader("Configuration",0);
    if (bVar3) {
      pIVar16 = GetIO();
      bVar3 = TreeNode("Configuration##2");
      if (bVar3) {
        CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",&pIVar16->ConfigFlags,1);
        SameLine(0.0,-1.0);
        HelpMarker("Enable keyboard controls.");
        CheckboxFlags("io.ConfigFlags: NavEnableGamepad",&pIVar16->ConfigFlags,2);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable gamepad controls. Require backend to set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details."
                  );
        CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos",&pIVar16->ConfigFlags,4);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos."
                  );
        CheckboxFlags("io.ConfigFlags: NoMouse",&pIVar16->ConfigFlags,0x10);
        if ((pIVar16->ConfigFlags & 0x10) != 0) {
          dVar30 = GetTime();
          fVar27 = fmodf((float)dVar30,0.4);
          if (fVar27 < 0.2) {
            SameLine(0.0,-1.0);
            Text("<<PRESS SPACE TO DISABLE>>");
          }
          iVar21 = GetKeyIndex(0xc);
          bVar3 = IsKeyPressed(iVar21,true);
          if (bVar3) {
            *(byte *)&pIVar16->ConfigFlags = (byte)pIVar16->ConfigFlags & 0xef;
          }
        }
        CheckboxFlags("io.ConfigFlags: NoMouseCursorChange",&pIVar16->ConfigFlags,0x20);
        SameLine(0.0,-1.0);
        HelpMarker("Instruct backend to not alter mouse cursor shape and visibility.");
        Checkbox("io.ConfigInputTextCursorBlink",&pIVar16->ConfigInputTextCursorBlink);
        SameLine(0.0,-1.0);
        HelpMarker("Enable blinking cursor (optional as some users consider it to be distracting)");
        Checkbox("io.ConfigDragClickToInputText",&pIVar16->ConfigDragClickToInputText);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable turning DragXXX widgets into text input with a simple mouse click-release (without moving)."
                  );
        Checkbox("io.ConfigWindowsResizeFromEdges",&pIVar16->ConfigWindowsResizeFromEdges);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback."
                  );
        Checkbox("io.ConfigWindowsMoveFromTitleBarOnly",&pIVar16->ConfigWindowsMoveFromTitleBarOnly)
        ;
        Checkbox("io.MouseDrawCursor",&pIVar16->MouseDrawCursor);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct Dear ImGui to render a mouse cursor itself. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something)."
                  );
        Text("Also see Style->Rendering for rendering options.");
        TreePop();
        Separator();
      }
      bVar3 = TreeNode("Backend Flags");
      if (bVar3) {
        HelpMarker(
                  "Those flags are set by the backends (imgui_impl_xxx files) to specify their capabilities.\nHere we expose then as read-only fields to avoid breaking interactions with your backend."
                  );
        doc = (MyDocument *)CONCAT44(doc._4_4_,pIVar16->BackendFlags);
        CheckboxFlags("io.BackendFlags: HasGamepad",(int *)&doc,1);
        CheckboxFlags("io.BackendFlags: HasMouseCursors",(int *)&doc,2);
        CheckboxFlags("io.BackendFlags: HasSetMousePos",(int *)&doc,4);
        CheckboxFlags("io.BackendFlags: RendererHasVtxOffset",(int *)&doc,8);
        TreePop();
        Separator();
      }
      bVar3 = TreeNode("Style");
      if (bVar3) {
        HelpMarker(
                  "The same contents can be accessed in \'Tools->Style Editor\' or by calling the ShowStyleEditor() function."
                  );
        ShowStyleEditor((ImGuiStyle *)0x0);
        TreePop();
        Separator();
      }
      bVar3 = TreeNode("Capture/Logging");
      if (bVar3) {
        HelpMarker(
                  "The logging API redirects all text output so you can easily capture the content of a window or a block. Tree nodes can be automatically expanded.\nTry opening any of the contents below in this window and then click one of the \"Log To\" button."
                  );
        LogButtons();
        HelpMarker(
                  "You can also call ImGui::LogText() to output directly to the log without a visual output."
                  );
        doc = (MyDocument *)0x0;
        bVar3 = Button("Copy \"Hello, world!\" to clipboard",(ImVec2 *)&doc);
        if (bVar3) {
          LogToClipboard(-1);
          LogText("Hello, world!");
          LogFinish();
        }
        TreePop();
      }
    }
    bVar3 = CollapsingHeader("Window options",0);
    if (bVar3) {
      doc = (MyDocument *)0x0;
      bVar3 = BeginTable("split",3,0,(ImVec2 *)&doc,0.0);
      if (bVar3) {
        TableNextColumn();
        Checkbox("No titlebar",&ShowDemoWindow::no_titlebar);
        TableNextColumn();
        Checkbox("No scrollbar",&ShowDemoWindow::no_scrollbar);
        TableNextColumn();
        Checkbox("No menu",&ShowDemoWindow::no_menu);
        TableNextColumn();
        Checkbox("No move",&ShowDemoWindow::no_move);
        TableNextColumn();
        Checkbox("No resize",&ShowDemoWindow::no_resize);
        TableNextColumn();
        Checkbox("No collapse",&ShowDemoWindow::no_collapse);
        TableNextColumn();
        Checkbox("No close",&ShowDemoWindow::no_close);
        TableNextColumn();
        Checkbox("No nav",&ShowDemoWindow::no_nav);
        TableNextColumn();
        Checkbox("No background",&ShowDemoWindow::no_background);
        TableNextColumn();
        Checkbox("No bring to front",&ShowDemoWindow::no_bring_to_front);
        EndTable();
      }
    }
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    bVar3 = CollapsingHeader("Popups & Modal windows",0);
    if (bVar3) {
      bVar3 = TreeNode("Popups");
      if (bVar3) {
        TextWrapped(
                   "When a popup is active, it inhibits interacting with windows that are behind the popup. Clicking outside the popup closes it."
                   );
        doc = (MyDocument *)0x0;
        bVar3 = Button("Select..",(ImVec2 *)&doc);
        if (bVar3) {
          OpenPopup("my_select_popup",0);
        }
        SameLine(0.0,-1.0);
        if ((long)ShowDemoWindowPopups()::selected_fish == -1) {
          pcVar14 = "<None>";
        }
        else {
          pcVar14 = (&PTR_anon_var_dwarf_36158_00221cb0)[ShowDemoWindowPopups()::selected_fish];
        }
        TextUnformatted(pcVar14,(char *)0x0);
        bVar3 = BeginPopup("my_select_popup",0);
        if (bVar3) {
          Text("Aquarium");
          Separator();
          ppuVar26 = &PTR_anon_var_dwarf_36158_00221cb0;
          for (lVar25 = 0; lVar25 != 5; lVar25 = lVar25 + 1) {
            doc = (MyDocument *)0x0;
            bVar3 = Selectable(*ppuVar26,false,0,(ImVec2 *)&doc);
            if (bVar3) {
              ShowDemoWindowPopups()::selected_fish = (int)lVar25;
            }
            ppuVar26 = ppuVar26 + 1;
          }
          EndPopup();
        }
        doc = (MyDocument *)0x0;
        bVar3 = Button("Toggle..",(ImVec2 *)&doc);
        if (bVar3) {
          OpenPopup("my_toggle_popup",0);
        }
        bVar3 = BeginPopup("my_toggle_popup",0);
        if (bVar3) {
          pbVar22 = (bool *)&ShowDemoWindowPopups()::toggles;
          for (lVar25 = 0; lVar25 != 0x28; lVar25 = lVar25 + 8) {
            MenuItem(*(char **)((long)&PTR_anon_var_dwarf_36158_00221cb0 + lVar25),"",pbVar22,true);
            pbVar22 = pbVar22 + 1;
          }
          bVar3 = BeginMenu("Sub-menu",true);
          if (bVar3) {
            MenuItem("Click me",(char *)0x0,false,true);
            EndMenu();
          }
          Separator();
          Text("Tooltip here");
          bVar3 = IsItemHovered(0);
          if (bVar3) {
            SetTooltip("I am a tooltip over a popup");
          }
          doc = (MyDocument *)0x0;
          bVar3 = Button("Stacked Popup",(ImVec2 *)&doc);
          if (bVar3) {
            OpenPopup("another popup",0);
          }
          bVar3 = BeginPopup("another popup",0);
          if (bVar3) {
            pbVar22 = (bool *)&ShowDemoWindowPopups()::toggles;
            for (lVar25 = 0; lVar25 != 0x28; lVar25 = lVar25 + 8) {
              MenuItem(*(char **)((long)&PTR_anon_var_dwarf_36158_00221cb0 + lVar25),"",pbVar22,true
                      );
              pbVar22 = pbVar22 + 1;
            }
            bVar3 = BeginMenu("Sub-menu",true);
            if (bVar3) {
              MenuItem("Click me",(char *)0x0,false,true);
              doc = (MyDocument *)0x0;
              bVar3 = Button("Stacked Popup",(ImVec2 *)&doc);
              if (bVar3) {
                OpenPopup("another popup",0);
              }
              bVar3 = BeginPopup("another popup",0);
              if (bVar3) {
                Text("I am the last one here.");
                EndPopup();
              }
              EndMenu();
            }
            EndPopup();
          }
          EndPopup();
        }
        doc = (MyDocument *)0x0;
        bVar3 = Button("File Menu..",(ImVec2 *)&doc);
        if (bVar3) {
          OpenPopup("my_file_popup",0);
        }
        bVar3 = BeginPopup("my_file_popup",0);
        if (bVar3) {
          ShowExampleMenuFile();
          EndPopup();
        }
        TreePop();
      }
      bVar3 = TreeNode("Context menus");
      if (bVar3) {
        Text("Value = %.3f (<-- right-click here)",(double)ShowDemoWindowPopups()::value);
        bVar3 = BeginPopupContextItem("item context menu",1);
        if (bVar3) {
          doc = (MyDocument *)0x0;
          bVar3 = Selectable("Set to zero",false,0,(ImVec2 *)&doc);
          if (bVar3) {
            ShowDemoWindowPopups()::value = 0.0;
          }
          doc = (MyDocument *)0x0;
          bVar3 = Selectable("Set to PI",false,0,(ImVec2 *)&doc);
          if (bVar3) {
            ShowDemoWindowPopups()::value = 3.1415;
          }
          SetNextItemWidth(-1.0);
          DragFloat("##Value",&ShowDemoWindowPopups()::value,0.1,0.0,0.0,"%.3f",0);
          EndPopup();
        }
        Text("(You can also right-click me to open the same popup as above.)");
        OpenPopupOnItemClick("item context menu",1);
        sprintf((char *)&doc,"Button: %s###Button",ShowDemoWindowPopups()::name);
        canvas_sz.x = 0.0;
        canvas_sz.y = 0.0;
        Button((char *)&doc,&canvas_sz);
        bVar3 = BeginPopupContextItem((char *)0x0,1);
        if (bVar3) {
          Text("Edit name:");
          InputText("##edit",ShowDemoWindowPopups()::name,0x20,0,(ImGuiInputTextCallback)0x0,
                    (void *)0x0);
          canvas_sz.x = 0.0;
          canvas_sz.y = 0.0;
          bVar3 = Button("Close",&canvas_sz);
          if (bVar3) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        SameLine(0.0,-1.0);
        Text("(<-- right-click here)");
        TreePop();
      }
      bVar3 = TreeNode("Modals");
      if (bVar3) {
        TextWrapped(
                   "Modal windows are like popups but the user cannot close them by clicking outside."
                   );
        doc = (MyDocument *)0x0;
        bVar3 = Button("Delete..",(ImVec2 *)&doc);
        if (bVar3) {
          OpenPopup("Delete?",0);
        }
        pIVar16 = GetIO();
        IVar31 = pIVar16->DisplaySize;
        pIVar16 = GetIO();
        local_158 = IVar31.x;
        doc = (MyDocument *)CONCAT44((pIVar16->DisplaySize).y * 0.5,local_158 * 0.5);
        canvas_sz.x = 0.5;
        canvas_sz.y = 0.5;
        SetNextWindowPos((ImVec2 *)&doc,8,&canvas_sz);
        bVar3 = BeginPopupModal("Delete?",(bool *)0x0,0x40);
        if (bVar3) {
          Text("All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n");
          Separator();
          canvas_sz.x = 0.0;
          canvas_sz.y = 0.0;
          PushStyleVar(10,&canvas_sz);
          Checkbox("Don\'t ask me next time",(bool *)&ShowDemoWindowPopups()::dont_ask_me_next_time)
          ;
          PopStyleVar(1);
          canvas_sz.x = 120.0;
          canvas_sz.y = 0.0;
          bVar3 = Button("OK",&canvas_sz);
          if (bVar3) {
            CloseCurrentPopup();
          }
          SetItemDefaultFocus();
          SameLine(0.0,-1.0);
          canvas_sz.x = 120.0;
          canvas_sz.y = 0.0;
          bVar3 = Button("Cancel",&canvas_sz);
          if (bVar3) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        canvas_sz.x = 0.0;
        canvas_sz.y = 0.0;
        bVar3 = Button("Stacked modals..",&canvas_sz);
        if (bVar3) {
          OpenPopup("Stacked 1",0);
        }
        bVar3 = BeginPopupModal("Stacked 1",(bool *)0x0,0x400);
        if (bVar3) {
          bVar3 = BeginMenuBar();
          if (bVar3) {
            bVar3 = BeginMenu("File",true);
            if (bVar3) {
              MenuItem("Some menu item",(char *)0x0,false,true);
              EndMenu();
            }
            EndMenuBar();
          }
          Text(
              "Hello from Stacked The First\nUsing style.Colors[ImGuiCol_ModalWindowDimBg] behind it."
              );
          Combo("Combo",&ShowDemoWindowPopups()::item,"aaaa",-1);
          ColorEdit4("color",(float *)ShowDemoWindowPopups()::color,0);
          canvas_sz.x = 0.0;
          canvas_sz.y = 0.0;
          bVar3 = Button("Add another modal..",&canvas_sz);
          if (bVar3) {
            OpenPopup("Stacked 2",0);
          }
          gradient_size.x._0_1_ = 1;
          bVar3 = BeginPopupModal("Stacked 2",(bool *)&gradient_size,0);
          if (bVar3) {
            Text("Hello from Stacked The Second!");
            canvas_sz.x = 0.0;
            canvas_sz.y = 0.0;
            bVar3 = Button("Close",&canvas_sz);
            if (bVar3) {
              CloseCurrentPopup();
            }
            EndPopup();
          }
          canvas_sz.x = 0.0;
          canvas_sz.y = 0.0;
          bVar3 = Button("Close",&canvas_sz);
          if (bVar3) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        TreePop();
      }
      bVar3 = TreeNode("Menus inside a regular window");
      if (bVar3) {
        TextWrapped(
                   "Below we are testing adding menu items to a regular window. It\'s rather unusual but should work!"
                   );
        Separator();
        PushID("foo");
        MenuItem("Menu item","CTRL+M",false,true);
        bVar3 = BeginMenu("Menu inside a regular window",true);
        if (bVar3) {
          ShowExampleMenuFile();
          EndMenu();
        }
        PopID();
        Separator();
        TreePop();
      }
    }
    ShowDemoWindowTables();
    bVar3 = CollapsingHeader("Filtering",0);
    if (bVar3) {
      if ((ShowDemoWindowMisc()::filter == '\0') &&
         (iVar21 = __cxa_guard_acquire(&ShowDemoWindowMisc()::filter), iVar21 != 0)) {
        ImGuiTextFilter::ImGuiTextFilter((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"");
        __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,ShowDemoWindowMisc()::filter,&__dso_handle);
        __cxa_guard_release(&ShowDemoWindowMisc()::filter);
      }
      Text(
          "Filter usage:\n  \"\"         display all lines\n  \"xxx\"      display lines containing \"xxx\"\n  \"xxx,yyy\"  display lines containing \"xxx\" or \"yyy\"\n  \"-xxx\"     hide lines containing \"xxx\""
          );
      ImGuiTextFilter::Draw((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"Filter (inc,-exc)",0.0)
      ;
      for (lVar25 = 0; lVar25 != 0x40; lVar25 = lVar25 + 8) {
        bVar3 = ImGuiTextFilter::PassFilter
                          ((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,
                           *(char **)((long)&PTR_anon_var_dwarf_3bf47_00221f50 + lVar25),(char *)0x0
                          );
        if (bVar3) {
          BulletText("%s");
        }
      }
    }
    bVar3 = CollapsingHeader("Inputs, Navigation & Focus",0);
    if (bVar3) {
      pIVar16 = GetIO();
      Text("WantCaptureMouse: %d",(ulong)pIVar16->WantCaptureMouse);
      Text("WantCaptureKeyboard: %d",(ulong)pIVar16->WantCaptureKeyboard);
      Text("WantTextInput: %d",(ulong)pIVar16->WantTextInput);
      Text("WantSetMousePos: %d",(ulong)pIVar16->WantSetMousePos);
      Text("NavActive: %d, NavVisible: %d",(ulong)pIVar16->NavActive,(ulong)pIVar16->NavVisible);
      bVar3 = TreeNode("Keyboard, Mouse & Navigation State");
      if (bVar3) {
        bVar3 = IsMousePosValid((ImVec2 *)0x0);
        if (bVar3) {
          Text("Mouse pos: (%g, %g)",(double)(pIVar16->MousePos).x,(double)(pIVar16->MousePos).y);
        }
        else {
          Text("Mouse pos: <INVALID>");
        }
        Text("Mouse delta: (%g, %g)",(double)(pIVar16->MouseDelta).x);
        Text("Mouse down:");
        for (lVar25 = 0; lVar25 != 5; lVar25 = lVar25 + 1) {
          if (0.0 <= pIVar16->MouseDownDuration[lVar25]) {
            SameLine(0.0,-1.0);
            Text("b%d (%.02f secs)",(double)pIVar16->MouseDownDuration[lVar25]);
          }
        }
        Text("Mouse clicked:");
        for (iVar21 = 0; iVar21 != 5; iVar21 = iVar21 + 1) {
          bVar3 = IsMouseClicked(iVar21,false);
          if (bVar3) {
            SameLine(0.0,-1.0);
            Text("b%d");
          }
        }
        Text("Mouse dblclick:");
        for (uVar6 = 0; uVar6 != 5; uVar6 = uVar6 + 1) {
          bVar3 = IsMouseDoubleClicked(uVar6);
          if (bVar3) {
            SameLine(0.0,-1.0);
            Text("b%d",(ulong)uVar6);
          }
        }
        Text("Mouse released:");
        for (uVar6 = 0; uVar6 != 5; uVar6 = uVar6 + 1) {
          bVar3 = IsMouseReleased(uVar6);
          if (bVar3) {
            SameLine(0.0,-1.0);
            Text("b%d",(ulong)uVar6);
          }
        }
        Text("Mouse wheel: %.1f",(double)pIVar16->MouseWheel);
        Text("Keys down:");
        for (uVar32 = 0; uVar32 != 0x200; uVar32 = uVar32 + 1) {
          if (0.0 <= pIVar16->KeysDownDuration[uVar32]) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X) (%.02f secs)",(double)pIVar16->KeysDownDuration[uVar32],
                 uVar32 & 0xffffffff,uVar32 & 0xffffffff);
          }
        }
        Text("Keys pressed:");
        for (uVar6 = 0; uVar6 != 0x200; uVar6 = uVar6 + 1) {
          bVar3 = IsKeyPressed(uVar6,true);
          if (bVar3) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X)",(ulong)uVar6,(ulong)uVar6);
          }
        }
        Text("Keys release:");
        for (uVar6 = 0; uVar6 != 0x200; uVar6 = uVar6 + 1) {
          bVar3 = IsKeyReleased(uVar6);
          if (bVar3) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X)",(ulong)uVar6,(ulong)uVar6);
          }
        }
        pcVar14 = "CTRL ";
        if (pIVar16->KeyCtrl == false) {
          pcVar14 = "";
        }
        pcVar15 = "SHIFT ";
        if (pIVar16->KeyShift == false) {
          pcVar15 = "";
        }
        Text("Keys mods: %s%s%s%s",pcVar14,pcVar15);
        Text("Chars queue:");
        for (iVar21 = 0; iVar21 < (pIVar16->InputQueueCharacters).Size; iVar21 = iVar21 + 1) {
          puVar20 = ImVector<unsigned_short>::operator[](&pIVar16->InputQueueCharacters,iVar21);
          uVar2 = *puVar20;
          SameLine(0.0,-1.0);
          uVar32 = (ulong)(uint)(int)(char)uVar2;
          if (0xde < (ushort)(uVar2 - 0x21)) {
            uVar32 = 0x3f;
          }
          Text("\'%c\' (0x%04X)",uVar32,(ulong)uVar2);
        }
        Text("NavInputs down:");
        for (uVar32 = 0; uVar32 != 0x15; uVar32 = uVar32 + 1) {
          if (0.0 < pIVar16->NavInputs[uVar32]) {
            SameLine(0.0,-1.0);
            Text("[%d] %.2f",(double)pIVar16->NavInputs[uVar32],uVar32 & 0xffffffff);
          }
        }
        Text("NavInputs pressed:");
        for (uVar32 = 0; uVar32 != 0x15; uVar32 = uVar32 + 1) {
          if ((pIVar16->NavInputsDownDuration[uVar32] == 0.0) &&
             (!NAN(pIVar16->NavInputsDownDuration[uVar32]))) {
            SameLine(0.0,-1.0);
            Text("[%d]",uVar32 & 0xffffffff);
          }
        }
        Text("NavInputs duration:");
        for (uVar32 = 0; uVar32 != 0x15; uVar32 = uVar32 + 1) {
          if (0.0 <= pIVar16->NavInputsDownDuration[uVar32]) {
            SameLine(0.0,-1.0);
            Text("[%d] %.2f",(double)pIVar16->NavInputsDownDuration[uVar32],uVar32 & 0xffffffff);
          }
        }
        doc = (MyDocument *)0x0;
        Button("Hovering me sets the\nkeyboard capture flag",(ImVec2 *)&doc);
        bVar3 = IsItemHovered(0);
        if (bVar3) {
          CaptureKeyboardFromApp(true);
        }
        SameLine(0.0,-1.0);
        doc = (MyDocument *)0x0;
        Button("Holding me clears the\nthe keyboard capture flag",(ImVec2 *)&doc);
        bVar3 = IsItemActive();
        if (bVar3) {
          CaptureKeyboardFromApp(false);
        }
        TreePop();
      }
      bVar3 = TreeNode("Tabbing");
      if (bVar3) {
        Text("Use TAB/SHIFT+TAB to cycle through keyboard editable fields.");
        InputText("1",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        InputText("2",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        InputText("3",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        PushAllowKeyboardFocus(false);
        InputText("4 (tab skip)",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,
                  (void *)0x0);
        PopAllowKeyboardFocus();
        InputText("5",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        TreePop();
      }
      bVar3 = TreeNode("Focus from code");
      if (bVar3) {
        doc = (MyDocument *)0x0;
        bVar3 = Button("Focus on 1",(ImVec2 *)&doc);
        SameLine(0.0,-1.0);
        doc = (MyDocument *)0x0;
        bVar4 = Button("Focus on 2",(ImVec2 *)&doc);
        SameLine(0.0,-1.0);
        doc = (MyDocument *)0x0;
        bVar5 = Button("Focus on 3",(ImVec2 *)&doc);
        if (bVar3) {
          SetKeyboardFocusHere(0);
        }
        InputText("1",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        bVar3 = IsItemActive();
        if (bVar4) {
          SetKeyboardFocusHere(0);
        }
        InputText("2",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        bVar4 = IsItemActive();
        uVar6 = (uint)bVar3;
        if (bVar4) {
          uVar6 = 2;
        }
        PushAllowKeyboardFocus(false);
        if (bVar5) {
          SetKeyboardFocusHere(0);
        }
        InputText("3 (tab skip)",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,
                  (void *)0x0);
        bVar3 = IsItemActive();
        if (bVar3) {
          uVar6 = 3;
        }
        PopAllowKeyboardFocus();
        if (uVar6 == 0) {
          Text("Item with focus: <none>");
        }
        else {
          Text("Item with focus: %d",(ulong)uVar6);
        }
        doc = (MyDocument *)0x0;
        bVar3 = Button("Focus on X",(ImVec2 *)&doc);
        SameLine(0.0,-1.0);
        doc = (MyDocument *)0x0;
        bVar4 = Button("Focus on Y",(ImVec2 *)&doc);
        iVar21 = 1;
        if (!bVar4) {
          iVar21 = bVar3 - 1;
        }
        SameLine(0.0,-1.0);
        doc = (MyDocument *)0x0;
        bVar3 = Button("Focus on Z",(ImVec2 *)&doc);
        if (bVar3) {
          iVar21 = 2;
        }
        if (iVar21 != -1) {
          SetKeyboardFocusHere(iVar21);
        }
        SliderFloat3("Float3",(float *)ShowDemoWindowMisc()::f3,0.0,1.0,"%.3f",0);
        TextWrapped("NB: Cursor & selection are preserved when refocusing last used item in code.");
        TreePop();
      }
      bVar3 = TreeNode("Dragging");
      if (bVar3) {
        TextWrapped(
                   "You can use ImGui::GetMouseDragDelta(0) to query for the dragged amount on any widget."
                   );
        for (uVar6 = 0; uVar6 != 3; uVar6 = uVar6 + 1) {
          Text("IsMouseDragging(%d):",(ulong)uVar6);
          bVar3 = IsMouseDragging(uVar6,-1.0);
          Text("  w/ default threshold: %d,",(ulong)bVar3);
          bVar3 = IsMouseDragging(uVar6,0.0);
          Text("  w/ zero threshold: %d,",(ulong)bVar3);
          bVar3 = IsMouseDragging(uVar6,20.0);
          Text("  w/ large threshold: %d,",(ulong)bVar3);
        }
        doc = (MyDocument *)0x0;
        Button("Drag Me",(ImVec2 *)&doc);
        bVar3 = IsItemActive();
        if (bVar3) {
          pIVar17 = GetForegroundDrawList();
          IVar7 = GetColorU32(0x15,1.0);
          ImDrawList::AddLine(pIVar17,pIVar16->MouseClickedPos,&pIVar16->MousePos,IVar7,4.0);
        }
        IVar31 = GetMouseDragDelta(0,0.0);
        local_48 = GetMouseDragDelta(0,-1.0);
        fVar27 = (pIVar16->MouseDelta).x;
        local_128 = (undefined1  [8])(double)(pIVar16->MouseDelta).y;
        uStack_40 = extraout_XMM0_Qb_02;
        Text("GetMouseDragDelta(0):");
        Text("  w/ default threshold: (%.1f, %.1f)",(double)local_48.x,(double)local_48.y);
        local_108 = IVar31.x;
        fStack_104 = IVar31.y;
        Text("  w/ zero threshold: (%.1f, %.1f)",(double)local_108,(double)fStack_104);
        Text("io.MouseDelta: (%.1f, %.1f)",(double)fVar27,local_128);
        TreePop();
      }
      bVar3 = TreeNode("Mouse cursors");
      if (bVar3) {
        IVar10 = GetMouseCursor();
        puVar24 = &DAT_00221f90;
        Text("Current mouse cursor = %d: %s",(long)IVar10,(&DAT_00221f90)[IVar10]);
        Text("Hover to see mouse cursors:");
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Your application can render a different mouse cursor based on what ImGui::GetMouseCursor() returns. If software cursor rendering (io.MouseDrawCursor) is set ImGui will draw the right cursor for you, otherwise your backend needs to handle it."
                  );
        for (uVar32 = 0; uVar32 != 9; uVar32 = uVar32 + 1) {
          sprintf((char *)&doc,"Mouse cursor %d: %s",uVar32 & 0xffffffff,*puVar24);
          Bullet();
          canvas_sz.x = 0.0;
          canvas_sz.y = 0.0;
          Selectable((char *)&doc,false,0,&canvas_sz);
          bVar3 = IsItemHovered(0);
          if (bVar3) {
            SetMouseCursor((ImGuiMouseCursor)uVar32);
          }
          puVar24 = puVar24 + 1;
        }
        TreePop();
      }
    }
    PopItemWidth();
  }
  End();
  return;
}

Assistant:

void ImGui::ShowDemoWindow(bool* p_open)
{
    // Exceptionally add an extra assert here for people confused about initial Dear ImGui setup
    // Most ImGui functions would normally just crash if the context is missing.
    IM_ASSERT(ImGui::GetCurrentContext() != NULL && "Missing dear imgui context. Refer to examples app!");

    // Examples Apps (accessible from the "Examples" menu)
    static bool show_app_main_menu_bar = false;
    static bool show_app_documents = false;
    static bool show_app_console = false;
    static bool show_app_log = false;
    static bool show_app_layout = false;
    static bool show_app_property_editor = false;
    static bool show_app_long_text = false;
    static bool show_app_auto_resize = false;
    static bool show_app_constrained_resize = false;
    static bool show_app_simple_overlay = false;
    static bool show_app_window_titles = false;
    static bool show_app_custom_rendering = false;

    if (show_app_main_menu_bar)       ShowExampleAppMainMenuBar();
    if (show_app_documents)           ShowExampleAppDocuments(&show_app_documents);

    if (show_app_console)             ShowExampleAppConsole(&show_app_console);
    if (show_app_log)                 ShowExampleAppLog(&show_app_log);
    if (show_app_layout)              ShowExampleAppLayout(&show_app_layout);
    if (show_app_property_editor)     ShowExampleAppPropertyEditor(&show_app_property_editor);
    if (show_app_long_text)           ShowExampleAppLongText(&show_app_long_text);
    if (show_app_auto_resize)         ShowExampleAppAutoResize(&show_app_auto_resize);
    if (show_app_constrained_resize)  ShowExampleAppConstrainedResize(&show_app_constrained_resize);
    if (show_app_simple_overlay)      ShowExampleAppSimpleOverlay(&show_app_simple_overlay);
    if (show_app_window_titles)       ShowExampleAppWindowTitles(&show_app_window_titles);
    if (show_app_custom_rendering)    ShowExampleAppCustomRendering(&show_app_custom_rendering);

    // Dear ImGui Apps (accessible from the "Tools" menu)
    static bool show_app_metrics = false;
    static bool show_app_style_editor = false;
    static bool show_app_about = false;

    if (show_app_metrics)       { ImGui::ShowMetricsWindow(&show_app_metrics); }
    if (show_app_about)         { ImGui::ShowAboutWindow(&show_app_about); }
    if (show_app_style_editor)
    {
        ImGui::Begin("Dear ImGui Style Editor", &show_app_style_editor);
        ImGui::ShowStyleEditor();
        ImGui::End();
    }

    // Demonstrate the various window flags. Typically you would just use the default!
    static bool no_titlebar = false;
    static bool no_scrollbar = false;
    static bool no_menu = false;
    static bool no_move = false;
    static bool no_resize = false;
    static bool no_collapse = false;
    static bool no_close = false;
    static bool no_nav = false;
    static bool no_background = false;
    static bool no_bring_to_front = false;

    ImGuiWindowFlags window_flags = 0;
    if (no_titlebar)        window_flags |= ImGuiWindowFlags_NoTitleBar;
    if (no_scrollbar)       window_flags |= ImGuiWindowFlags_NoScrollbar;
    if (!no_menu)           window_flags |= ImGuiWindowFlags_MenuBar;
    if (no_move)            window_flags |= ImGuiWindowFlags_NoMove;
    if (no_resize)          window_flags |= ImGuiWindowFlags_NoResize;
    if (no_collapse)        window_flags |= ImGuiWindowFlags_NoCollapse;
    if (no_nav)             window_flags |= ImGuiWindowFlags_NoNav;
    if (no_background)      window_flags |= ImGuiWindowFlags_NoBackground;
    if (no_bring_to_front)  window_flags |= ImGuiWindowFlags_NoBringToFrontOnFocus;
    if (no_close)           p_open = NULL; // Don't pass our bool* to Begin

    // We specify a default position/size in case there's no data in the .ini file.
    // We only do it to make the demo applications a little more welcoming, but typically this isn't required.
    ImGui::SetNextWindowPos(ImVec2(650, 20), ImGuiCond_FirstUseEver);
    ImGui::SetNextWindowSize(ImVec2(550, 680), ImGuiCond_FirstUseEver);

    // Main body of the Demo window starts here.
    if (!ImGui::Begin("Dear ImGui Demo", p_open, window_flags))
    {
        // Early out if the window is collapsed, as an optimization.
        ImGui::End();
        return;
    }

    // Most "big" widgets share a common width settings by default. See 'Demo->Layout->Widgets Width' for details.

    // e.g. Use 2/3 of the space for widgets and 1/3 for labels (right align)
    //ImGui::PushItemWidth(-ImGui::GetWindowWidth() * 0.35f);

    // e.g. Leave a fixed amount of width for labels (by passing a negative value), the rest goes to widgets.
    ImGui::PushItemWidth(ImGui::GetFontSize() * -12);

    // Menu Bar
    if (ImGui::BeginMenuBar())
    {
        if (ImGui::BeginMenu("Menu"))
        {
            ShowExampleMenuFile();
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Examples"))
        {
            ImGui::MenuItem("Main menu bar", NULL, &show_app_main_menu_bar);
            ImGui::MenuItem("Console", NULL, &show_app_console);
            ImGui::MenuItem("Log", NULL, &show_app_log);
            ImGui::MenuItem("Simple layout", NULL, &show_app_layout);
            ImGui::MenuItem("Property editor", NULL, &show_app_property_editor);
            ImGui::MenuItem("Long text display", NULL, &show_app_long_text);
            ImGui::MenuItem("Auto-resizing window", NULL, &show_app_auto_resize);
            ImGui::MenuItem("Constrained-resizing window", NULL, &show_app_constrained_resize);
            ImGui::MenuItem("Simple overlay", NULL, &show_app_simple_overlay);
            ImGui::MenuItem("Manipulating window titles", NULL, &show_app_window_titles);
            ImGui::MenuItem("Custom rendering", NULL, &show_app_custom_rendering);
            ImGui::MenuItem("Documents", NULL, &show_app_documents);
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Tools"))
        {
            ImGui::MenuItem("Metrics/Debugger", NULL, &show_app_metrics);
            ImGui::MenuItem("Style Editor", NULL, &show_app_style_editor);
            ImGui::MenuItem("About Dear ImGui", NULL, &show_app_about);
            ImGui::EndMenu();
        }
        ImGui::EndMenuBar();
    }

    ImGui::Text("dear imgui says hello. (%s)", IMGUI_VERSION);
    ImGui::Spacing();

    if (ImGui::CollapsingHeader("Help"))
    {
        ImGui::Text("ABOUT THIS DEMO:");
        ImGui::BulletText("Sections below are demonstrating many aspects of the library.");
        ImGui::BulletText("The \"Examples\" menu above leads to more demo contents.");
        ImGui::BulletText("The \"Tools\" menu above gives access to: About Box, Style Editor,\n"
                          "and Metrics/Debugger (general purpose Dear ImGui debugging tool).");
        ImGui::Separator();

        ImGui::Text("PROGRAMMER GUIDE:");
        ImGui::BulletText("See the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
        ImGui::BulletText("See comments in imgui.cpp.");
        ImGui::BulletText("See example applications in the examples/ folder.");
        ImGui::BulletText("Read the FAQ at http://www.dearimgui.org/faq/");
        ImGui::BulletText("Set 'io.ConfigFlags |= NavEnableKeyboard' for keyboard controls.");
        ImGui::BulletText("Set 'io.ConfigFlags |= NavEnableGamepad' for gamepad controls.");
        ImGui::Separator();

        ImGui::Text("USER GUIDE:");
        ImGui::ShowUserGuide();
    }

    if (ImGui::CollapsingHeader("Configuration"))
    {
        ImGuiIO& io = ImGui::GetIO();

        if (ImGui::TreeNode("Configuration##2"))
        {
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",    &io.ConfigFlags, ImGuiConfigFlags_NavEnableKeyboard);
            ImGui::SameLine(); HelpMarker("Enable keyboard controls.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableGamepad",     &io.ConfigFlags, ImGuiConfigFlags_NavEnableGamepad);
            ImGui::SameLine(); HelpMarker("Enable gamepad controls. Require backend to set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos", &io.ConfigFlags, ImGuiConfigFlags_NavEnableSetMousePos);
            ImGui::SameLine(); HelpMarker("Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos.");
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouse",              &io.ConfigFlags, ImGuiConfigFlags_NoMouse);
            if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)
            {
                // The "NoMouse" option can get us stuck with a disabled mouse! Let's provide an alternative way to fix it:
                if (fmodf((float)ImGui::GetTime(), 0.40f) < 0.20f)
                {
                    ImGui::SameLine();
                    ImGui::Text("<<PRESS SPACE TO DISABLE>>");
                }
                if (ImGui::IsKeyPressed(ImGui::GetKeyIndex(ImGuiKey_Space)))
                    io.ConfigFlags &= ~ImGuiConfigFlags_NoMouse;
            }
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouseCursorChange", &io.ConfigFlags, ImGuiConfigFlags_NoMouseCursorChange);
            ImGui::SameLine(); HelpMarker("Instruct backend to not alter mouse cursor shape and visibility.");
            ImGui::Checkbox("io.ConfigInputTextCursorBlink", &io.ConfigInputTextCursorBlink);
            ImGui::SameLine(); HelpMarker("Enable blinking cursor (optional as some users consider it to be distracting)");
            ImGui::Checkbox("io.ConfigDragClickToInputText", &io.ConfigDragClickToInputText);
            ImGui::SameLine(); HelpMarker("Enable turning DragXXX widgets into text input with a simple mouse click-release (without moving).");
            ImGui::Checkbox("io.ConfigWindowsResizeFromEdges", &io.ConfigWindowsResizeFromEdges);
            ImGui::SameLine(); HelpMarker("Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback.");
            ImGui::Checkbox("io.ConfigWindowsMoveFromTitleBarOnly", &io.ConfigWindowsMoveFromTitleBarOnly);
            ImGui::Checkbox("io.MouseDrawCursor", &io.MouseDrawCursor);
            ImGui::SameLine(); HelpMarker("Instruct Dear ImGui to render a mouse cursor itself. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something).");
            ImGui::Text("Also see Style->Rendering for rendering options.");
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Backend Flags"))
        {
            HelpMarker(
                "Those flags are set by the backends (imgui_impl_xxx files) to specify their capabilities.\n"
                "Here we expose then as read-only fields to avoid breaking interactions with your backend.");

            // Make a local copy to avoid modifying actual backend flags.
            ImGuiBackendFlags backend_flags = io.BackendFlags;
            ImGui::CheckboxFlags("io.BackendFlags: HasGamepad",           &backend_flags, ImGuiBackendFlags_HasGamepad);
            ImGui::CheckboxFlags("io.BackendFlags: HasMouseCursors",      &backend_flags, ImGuiBackendFlags_HasMouseCursors);
            ImGui::CheckboxFlags("io.BackendFlags: HasSetMousePos",       &backend_flags, ImGuiBackendFlags_HasSetMousePos);
            ImGui::CheckboxFlags("io.BackendFlags: RendererHasVtxOffset", &backend_flags, ImGuiBackendFlags_RendererHasVtxOffset);
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Style"))
        {
            HelpMarker("The same contents can be accessed in 'Tools->Style Editor' or by calling the ShowStyleEditor() function.");
            ImGui::ShowStyleEditor();
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Capture/Logging"))
        {
            HelpMarker(
                "The logging API redirects all text output so you can easily capture the content of "
                "a window or a block. Tree nodes can be automatically expanded.\n"
                "Try opening any of the contents below in this window and then click one of the \"Log To\" button.");
            ImGui::LogButtons();

            HelpMarker("You can also call ImGui::LogText() to output directly to the log without a visual output.");
            if (ImGui::Button("Copy \"Hello, world!\" to clipboard"))
            {
                ImGui::LogToClipboard();
                ImGui::LogText("Hello, world!");
                ImGui::LogFinish();
            }
            ImGui::TreePop();
        }
    }

    if (ImGui::CollapsingHeader("Window options"))
    {
        if (ImGui::BeginTable("split", 3))
        {
            ImGui::TableNextColumn(); ImGui::Checkbox("No titlebar", &no_titlebar);
            ImGui::TableNextColumn(); ImGui::Checkbox("No scrollbar", &no_scrollbar);
            ImGui::TableNextColumn(); ImGui::Checkbox("No menu", &no_menu);
            ImGui::TableNextColumn(); ImGui::Checkbox("No move", &no_move);
            ImGui::TableNextColumn(); ImGui::Checkbox("No resize", &no_resize);
            ImGui::TableNextColumn(); ImGui::Checkbox("No collapse", &no_collapse);
            ImGui::TableNextColumn(); ImGui::Checkbox("No close", &no_close);
            ImGui::TableNextColumn(); ImGui::Checkbox("No nav", &no_nav);
            ImGui::TableNextColumn(); ImGui::Checkbox("No background", &no_background);
            ImGui::TableNextColumn(); ImGui::Checkbox("No bring to front", &no_bring_to_front);
            ImGui::EndTable();
        }
    }

    // All demo contents
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    ShowDemoWindowPopups();
    ShowDemoWindowTables();
    ShowDemoWindowMisc();

    // End of ShowDemoWindow()
    ImGui::PopItemWidth();
    ImGui::End();
}